

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float fVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  bool bVar25;
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  undefined8 unaff_R13;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar56 [16];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar99 [64];
  float fVar100;
  undefined4 uVar101;
  vfloat4 a0_2;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar106 [64];
  float t1;
  undefined1 auVar110 [16];
  vfloat4 b0;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar118;
  vfloat4 a0_3;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  __m128 a_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  float fVar159;
  float fVar160;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar163 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar170 [16];
  undefined1 auVar179 [32];
  __m128 a;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar190;
  float fVar200;
  float fVar202;
  float fVar204;
  undefined1 auVar191 [16];
  float fVar201;
  float fVar203;
  float fVar205;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar206;
  float fVar215;
  float fVar216;
  vfloat4 a0_1;
  undefined1 auVar207 [16];
  float fVar217;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  vfloat4 a0;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint auStack_630 [4];
  RTCFilterFunctionNArguments local_620;
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar29;
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar225 [32];
  
  uVar28 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar28 * 0x19 + 0x12);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar46 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar40 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar41 = vsubps_avx(auVar38,*(undefined1 (*) [16])(prim + uVar28 * 0x19 + 6));
  fVar118 = fVar1 * auVar41._0_4_;
  fVar100 = fVar1 * auVar40._0_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar28 * 4 + 6);
  auVar71 = vpmovsxbd_avx2(auVar38);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar28 * 5 + 6);
  auVar69 = vpmovsxbd_avx2(auVar46);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar28 * 6 + 6);
  auVar70 = vpmovsxbd_avx2(auVar5);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar28 * 0xb + 6);
  auVar81 = vpmovsxbd_avx2(auVar47);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar28 * 0xc + 6);
  auVar82 = vpmovsxbd_avx2(auVar48);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar28 * 0xd + 6);
  auVar72 = vpmovsxbd_avx2(auVar43);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar28 * 0x12 + 6);
  auVar73 = vpmovsxbd_avx2(auVar51);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + uVar28 * 0x13 + 6);
  auVar76 = vpmovsxbd_avx2(auVar236);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar28 * 0x14 + 6);
  auVar67 = vpmovsxbd_avx2(auVar39);
  auVar74 = vcvtdq2ps_avx(auVar76);
  auVar75 = vcvtdq2ps_avx(auVar67);
  auVar129._4_4_ = fVar100;
  auVar129._0_4_ = fVar100;
  auVar129._8_4_ = fVar100;
  auVar129._12_4_ = fVar100;
  auVar129._16_4_ = fVar100;
  auVar129._20_4_ = fVar100;
  auVar129._24_4_ = fVar100;
  auVar129._28_4_ = fVar100;
  auVar231._8_4_ = 1;
  auVar231._0_8_ = 0x100000001;
  auVar231._12_4_ = 1;
  auVar231._16_4_ = 1;
  auVar231._20_4_ = 1;
  auVar231._24_4_ = 1;
  auVar231._28_4_ = 1;
  auVar77 = ZEXT1632(CONCAT412(fVar1 * auVar40._12_4_,
                               CONCAT48(fVar1 * auVar40._8_4_,
                                        CONCAT44(fVar1 * auVar40._4_4_,fVar100))));
  auVar68 = vpermps_avx2(auVar231,auVar77);
  auVar65 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar240 = ZEXT3264(auVar65);
  auVar66 = vpermps_avx512vl(auVar65,auVar77);
  fVar100 = auVar66._0_4_;
  fVar190 = auVar66._4_4_;
  auVar77._4_4_ = fVar190 * auVar70._4_4_;
  auVar77._0_4_ = fVar100 * auVar70._0_4_;
  fVar201 = auVar66._8_4_;
  auVar77._8_4_ = fVar201 * auVar70._8_4_;
  fVar203 = auVar66._12_4_;
  auVar77._12_4_ = fVar203 * auVar70._12_4_;
  fVar107 = auVar66._16_4_;
  auVar77._16_4_ = fVar107 * auVar70._16_4_;
  fVar108 = auVar66._20_4_;
  auVar77._20_4_ = fVar108 * auVar70._20_4_;
  fVar109 = auVar66._24_4_;
  auVar77._24_4_ = fVar109 * auVar70._24_4_;
  auVar77._28_4_ = auVar67._28_4_;
  auVar67._4_4_ = auVar72._4_4_ * fVar190;
  auVar67._0_4_ = auVar72._0_4_ * fVar100;
  auVar67._8_4_ = auVar72._8_4_ * fVar201;
  auVar67._12_4_ = auVar72._12_4_ * fVar203;
  auVar67._16_4_ = auVar72._16_4_ * fVar107;
  auVar67._20_4_ = auVar72._20_4_ * fVar108;
  auVar67._24_4_ = auVar72._24_4_ * fVar109;
  auVar67._28_4_ = auVar76._28_4_;
  auVar76._4_4_ = auVar75._4_4_ * fVar190;
  auVar76._0_4_ = auVar75._0_4_ * fVar100;
  auVar76._8_4_ = auVar75._8_4_ * fVar201;
  auVar76._12_4_ = auVar75._12_4_ * fVar203;
  auVar76._16_4_ = auVar75._16_4_ * fVar107;
  auVar76._20_4_ = auVar75._20_4_ * fVar108;
  auVar76._24_4_ = auVar75._24_4_ * fVar109;
  auVar76._28_4_ = auVar66._28_4_;
  auVar38 = vfmadd231ps_fma(auVar77,auVar68,auVar69);
  auVar46 = vfmadd231ps_fma(auVar67,auVar68,auVar82);
  auVar5 = vfmadd231ps_fma(auVar76,auVar74,auVar68);
  auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar129,auVar71);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar129,auVar81);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar73,auVar129);
  auVar142._4_4_ = fVar118;
  auVar142._0_4_ = fVar118;
  auVar142._8_4_ = fVar118;
  auVar142._12_4_ = fVar118;
  auVar142._16_4_ = fVar118;
  auVar142._20_4_ = fVar118;
  auVar142._24_4_ = fVar118;
  auVar142._28_4_ = fVar118;
  auVar67 = ZEXT1632(CONCAT412(fVar1 * auVar41._12_4_,
                               CONCAT48(fVar1 * auVar41._8_4_,
                                        CONCAT44(fVar1 * auVar41._4_4_,fVar118))));
  auVar76 = vpermps_avx2(auVar231,auVar67);
  auVar67 = vpermps_avx512vl(auVar65,auVar67);
  auVar68 = vmulps_avx512vl(auVar67,auVar70);
  auVar79._0_4_ = auVar67._0_4_ * auVar72._0_4_;
  auVar79._4_4_ = auVar67._4_4_ * auVar72._4_4_;
  auVar79._8_4_ = auVar67._8_4_ * auVar72._8_4_;
  auVar79._12_4_ = auVar67._12_4_ * auVar72._12_4_;
  auVar79._16_4_ = auVar67._16_4_ * auVar72._16_4_;
  auVar79._20_4_ = auVar67._20_4_ * auVar72._20_4_;
  auVar79._24_4_ = auVar67._24_4_ * auVar72._24_4_;
  auVar79._28_4_ = 0;
  auVar72._4_4_ = auVar67._4_4_ * auVar75._4_4_;
  auVar72._0_4_ = auVar67._0_4_ * auVar75._0_4_;
  auVar72._8_4_ = auVar67._8_4_ * auVar75._8_4_;
  auVar72._12_4_ = auVar67._12_4_ * auVar75._12_4_;
  auVar72._16_4_ = auVar67._16_4_ * auVar75._16_4_;
  auVar72._20_4_ = auVar67._20_4_ * auVar75._20_4_;
  auVar72._24_4_ = auVar67._24_4_ * auVar75._24_4_;
  auVar72._28_4_ = auVar70._28_4_;
  auVar69 = vfmadd231ps_avx512vl(auVar68,auVar76,auVar69);
  auVar47 = vfmadd231ps_fma(auVar79,auVar76,auVar82);
  auVar48 = vfmadd231ps_fma(auVar72,auVar76,auVar74);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar142,auVar71);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar142,auVar81);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar142,auVar73);
  auVar83._8_4_ = 0x7fffffff;
  auVar83._0_8_ = 0x7fffffff7fffffff;
  auVar83._12_4_ = 0x7fffffff;
  auVar83._16_4_ = 0x7fffffff;
  auVar83._20_4_ = 0x7fffffff;
  auVar83._24_4_ = 0x7fffffff;
  auVar83._28_4_ = 0x7fffffff;
  auVar71 = vandps_avx(ZEXT1632(auVar38),auVar83);
  auVar85._8_4_ = 0x219392ef;
  auVar85._0_8_ = 0x219392ef219392ef;
  auVar85._12_4_ = 0x219392ef;
  auVar85._16_4_ = 0x219392ef;
  auVar85._20_4_ = 0x219392ef;
  auVar85._24_4_ = 0x219392ef;
  auVar85._28_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar71,auVar85,1);
  bVar12 = (bool)((byte)uVar33 & 1);
  auVar68._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar38._0_4_;
  bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar38._4_4_;
  bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar38._8_4_;
  bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar38._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar71 = vandps_avx(ZEXT1632(auVar46),auVar83);
  uVar33 = vcmpps_avx512vl(auVar71,auVar85,1);
  bVar12 = (bool)((byte)uVar33 & 1);
  auVar65._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar46._0_4_;
  bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar46._4_4_;
  bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar46._8_4_;
  bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar46._12_4_;
  auVar65._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar65._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar65._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar65._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar71 = vandps_avx(ZEXT1632(auVar5),auVar83);
  uVar33 = vcmpps_avx512vl(auVar71,auVar85,1);
  bVar12 = (bool)((byte)uVar33 & 1);
  auVar71._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar5._0_4_;
  bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar5._4_4_;
  bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar5._8_4_;
  bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar5._12_4_;
  auVar71._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar71._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar71._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar71._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar70 = vrcp14ps_avx512vl(auVar68);
  auVar84._8_4_ = 0x3f800000;
  auVar84._0_8_ = 0x3f8000003f800000;
  auVar84._12_4_ = 0x3f800000;
  auVar84._16_4_ = 0x3f800000;
  auVar84._20_4_ = 0x3f800000;
  auVar84._24_4_ = 0x3f800000;
  auVar84._28_4_ = 0x3f800000;
  auVar38 = vfnmadd213ps_fma(auVar68,auVar70,auVar84);
  auVar38 = vfmadd132ps_fma(ZEXT1632(auVar38),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar65);
  auVar46 = vfnmadd213ps_fma(auVar65,auVar70,auVar84);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar71);
  auVar5 = vfnmadd213ps_fma(auVar71,auVar70,auVar84);
  auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar70,auVar70);
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 7 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx512vl(auVar71,auVar69);
  auVar73._4_4_ = auVar38._4_4_ * auVar71._4_4_;
  auVar73._0_4_ = auVar38._0_4_ * auVar71._0_4_;
  auVar73._8_4_ = auVar38._8_4_ * auVar71._8_4_;
  auVar73._12_4_ = auVar38._12_4_ * auVar71._12_4_;
  auVar73._16_4_ = auVar71._16_4_ * 0.0;
  auVar73._20_4_ = auVar71._20_4_ * 0.0;
  auVar73._24_4_ = auVar71._24_4_ * 0.0;
  auVar73._28_4_ = auVar71._28_4_;
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 9 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx512vl(auVar71,auVar69);
  auVar80._0_4_ = auVar38._0_4_ * auVar71._0_4_;
  auVar80._4_4_ = auVar38._4_4_ * auVar71._4_4_;
  auVar80._8_4_ = auVar38._8_4_ * auVar71._8_4_;
  auVar80._12_4_ = auVar38._12_4_ * auVar71._12_4_;
  auVar80._16_4_ = auVar71._16_4_ * 0.0;
  auVar80._20_4_ = auVar71._20_4_ * 0.0;
  auVar80._24_4_ = auVar71._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0xe + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,ZEXT1632(auVar47));
  auVar74._4_4_ = auVar46._4_4_ * auVar71._4_4_;
  auVar74._0_4_ = auVar46._0_4_ * auVar71._0_4_;
  auVar74._8_4_ = auVar46._8_4_ * auVar71._8_4_;
  auVar74._12_4_ = auVar46._12_4_ * auVar71._12_4_;
  auVar74._16_4_ = auVar71._16_4_ * 0.0;
  auVar74._20_4_ = auVar71._20_4_ * 0.0;
  auVar74._24_4_ = auVar71._24_4_ * 0.0;
  auVar74._28_4_ = auVar71._28_4_;
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,ZEXT1632(auVar47));
  auVar78._0_4_ = auVar46._0_4_ * auVar71._0_4_;
  auVar78._4_4_ = auVar46._4_4_ * auVar71._4_4_;
  auVar78._8_4_ = auVar46._8_4_ * auVar71._8_4_;
  auVar78._12_4_ = auVar46._12_4_ * auVar71._12_4_;
  auVar78._16_4_ = auVar71._16_4_ * 0.0;
  auVar78._20_4_ = auVar71._20_4_ * 0.0;
  auVar78._24_4_ = auVar71._24_4_ * 0.0;
  auVar78._28_4_ = 0;
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x15 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,ZEXT1632(auVar48));
  auVar75._4_4_ = auVar71._4_4_ * auVar5._4_4_;
  auVar75._0_4_ = auVar71._0_4_ * auVar5._0_4_;
  auVar75._8_4_ = auVar71._8_4_ * auVar5._8_4_;
  auVar75._12_4_ = auVar71._12_4_ * auVar5._12_4_;
  auVar75._16_4_ = auVar71._16_4_ * 0.0;
  auVar75._20_4_ = auVar71._20_4_ * 0.0;
  auVar75._24_4_ = auVar71._24_4_ * 0.0;
  auVar75._28_4_ = auVar71._28_4_;
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x17 + 6));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,ZEXT1632(auVar48));
  auVar66._0_4_ = auVar5._0_4_ * auVar71._0_4_;
  auVar66._4_4_ = auVar5._4_4_ * auVar71._4_4_;
  auVar66._8_4_ = auVar5._8_4_ * auVar71._8_4_;
  auVar66._12_4_ = auVar5._12_4_ * auVar71._12_4_;
  auVar66._16_4_ = auVar71._16_4_ * 0.0;
  auVar66._20_4_ = auVar71._20_4_ * 0.0;
  auVar66._24_4_ = auVar71._24_4_ * 0.0;
  auVar66._28_4_ = 0;
  auVar71 = vpminsd_avx2(auVar73,auVar80);
  auVar69 = vpminsd_avx2(auVar74,auVar78);
  auVar71 = vmaxps_avx(auVar71,auVar69);
  auVar69 = vpminsd_avx2(auVar75,auVar66);
  uVar101 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar70._4_4_ = uVar101;
  auVar70._0_4_ = uVar101;
  auVar70._8_4_ = uVar101;
  auVar70._12_4_ = uVar101;
  auVar70._16_4_ = uVar101;
  auVar70._20_4_ = uVar101;
  auVar70._24_4_ = uVar101;
  auVar70._28_4_ = uVar101;
  auVar69 = vmaxps_avx512vl(auVar69,auVar70);
  auVar71 = vmaxps_avx(auVar71,auVar69);
  auVar69._8_4_ = 0x3f7ffffa;
  auVar69._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar69._12_4_ = 0x3f7ffffa;
  auVar69._16_4_ = 0x3f7ffffa;
  auVar69._20_4_ = 0x3f7ffffa;
  auVar69._24_4_ = 0x3f7ffffa;
  auVar69._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar71,auVar69);
  auVar71 = vpmaxsd_avx2(auVar73,auVar80);
  auVar69 = vpmaxsd_avx2(auVar74,auVar78);
  auVar71 = vminps_avx(auVar71,auVar69);
  auVar69 = vpmaxsd_avx2(auVar75,auVar66);
  uVar101 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar81._4_4_ = uVar101;
  auVar81._0_4_ = uVar101;
  auVar81._8_4_ = uVar101;
  auVar81._12_4_ = uVar101;
  auVar81._16_4_ = uVar101;
  auVar81._20_4_ = uVar101;
  auVar81._24_4_ = uVar101;
  auVar81._28_4_ = uVar101;
  auVar69 = vminps_avx512vl(auVar69,auVar81);
  auVar71 = vminps_avx(auVar71,auVar69);
  auVar82._8_4_ = 0x3f800003;
  auVar82._0_8_ = 0x3f8000033f800003;
  auVar82._12_4_ = 0x3f800003;
  auVar82._16_4_ = 0x3f800003;
  auVar82._20_4_ = 0x3f800003;
  auVar82._24_4_ = 0x3f800003;
  auVar82._28_4_ = 0x3f800003;
  auVar71 = vmulps_avx512vl(auVar71,auVar82);
  auVar69 = vpbroadcastd_avx512vl();
  uVar13 = vcmpps_avx512vl(local_3c0,auVar71,2);
  uVar14 = vpcmpgtd_avx512vl(auVar69,_DAT_01fb4ba0);
  uVar33 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar13 & (byte)uVar14));
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar243 = ZEXT1664(auVar38);
  auVar106 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar106);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar106 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar232 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar233 = ZEXT1664(auVar38);
  auVar242 = ZEXT464(0x3f800000);
LAB_01a357e3:
  if (uVar33 == 0) {
LAB_01a37309:
    return uVar33 != 0;
  }
  lVar30 = 0;
  for (uVar28 = uVar33; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  uVar28 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar30 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar38 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * uVar28);
  lVar30 = uVar28 + 1;
  auVar46 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * lVar30);
  _Var10 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar5 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * uVar28);
  auVar47 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * lVar30);
  auVar86 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar86);
  auVar48 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar48 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar55 = auVar243._0_16_;
  auVar39 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * uVar28),
                       auVar38,auVar55);
  auVar40 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * lVar30),
                       auVar46,auVar55);
  auVar41 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar8[3].userPtr + uVar28 * *(long *)&pGVar8[3].fnumTimeSegments),
                       auVar5,auVar55);
  auVar42 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar8[3].userPtr + *(long *)&pGVar8[3].fnumTimeSegments * lVar30),
                       auVar47,auVar55);
  auVar49 = ZEXT816(0) << 0x40;
  auVar151._0_4_ = auVar46._0_4_ * 0.0;
  auVar151._4_4_ = auVar46._4_4_ * 0.0;
  auVar151._8_4_ = auVar46._8_4_ * 0.0;
  auVar151._12_4_ = auVar46._12_4_ * 0.0;
  auVar51 = vfmadd231ps_fma(auVar151,auVar40,auVar49);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar39,auVar51);
  auVar161._0_4_ = auVar43._0_4_ + auVar38._0_4_;
  auVar161._4_4_ = auVar43._4_4_ + auVar38._4_4_;
  auVar161._8_4_ = auVar43._8_4_ + auVar38._8_4_;
  auVar161._12_4_ = auVar43._12_4_ + auVar38._12_4_;
  auVar50 = auVar106._0_16_;
  auVar43 = vfmadd231ps_avx512vl(auVar51,auVar39,auVar50);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar38,auVar50);
  auVar207._0_4_ = auVar47._0_4_ * 0.0;
  auVar207._4_4_ = auVar47._4_4_ * 0.0;
  auVar207._8_4_ = auVar47._8_4_ * 0.0;
  auVar207._12_4_ = auVar47._12_4_ * 0.0;
  auVar51 = vfmadd231ps_fma(auVar207,auVar42,auVar49);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar41,auVar51);
  auVar218._0_4_ = auVar43._0_4_ + auVar5._0_4_;
  auVar218._4_4_ = auVar43._4_4_ + auVar5._4_4_;
  auVar218._8_4_ = auVar43._8_4_ + auVar5._8_4_;
  auVar218._12_4_ = auVar43._12_4_ + auVar5._12_4_;
  auVar43 = vfmadd231ps_avx512vl(auVar51,auVar41,auVar50);
  auVar45 = vfnmadd231ps_avx512vl(auVar43,auVar5,auVar50);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar40,auVar46);
  auVar43 = vfmadd231ps_fma(auVar43,auVar39,auVar49);
  auVar236 = vfmadd231ps_fma(auVar43,auVar38,auVar49);
  auVar46 = vmulps_avx512vl(auVar46,auVar50);
  auVar46 = vfnmadd231ps_avx512vl(auVar46,auVar50,auVar40);
  auVar46 = vfmadd231ps_fma(auVar46,auVar49,auVar39);
  auVar39 = vfnmadd231ps_fma(auVar46,auVar49,auVar38);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar42,auVar47);
  auVar38 = vfmadd231ps_fma(auVar38,auVar41,auVar49);
  auVar43 = vfmadd231ps_fma(auVar38,auVar5,auVar49);
  auVar38 = vmulps_avx512vl(auVar47,auVar50);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar50,auVar42);
  auVar38 = vfmadd231ps_fma(auVar38,auVar49,auVar41);
  auVar51 = vfnmadd231ps_fma(auVar38,auVar49,auVar5);
  auVar38 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar46 = vshufps_avx(auVar218,auVar218,0xc9);
  fVar118 = auVar44._0_4_;
  auVar59._0_4_ = fVar118 * auVar46._0_4_;
  fVar159 = auVar44._4_4_;
  auVar59._4_4_ = fVar159 * auVar46._4_4_;
  fVar160 = auVar44._8_4_;
  auVar59._8_4_ = fVar160 * auVar46._8_4_;
  fVar205 = auVar44._12_4_;
  auVar59._12_4_ = fVar205 * auVar46._12_4_;
  auVar46 = vfmsub231ps_fma(auVar59,auVar38,auVar218);
  auVar5 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar131._0_4_ = fVar118 * auVar46._0_4_;
  auVar131._4_4_ = fVar159 * auVar46._4_4_;
  auVar131._8_4_ = fVar160 * auVar46._8_4_;
  auVar131._12_4_ = fVar205 * auVar46._12_4_;
  auVar38 = vfmsub231ps_fma(auVar131,auVar38,auVar45);
  auVar47 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar46 = vshufps_avx(auVar43,auVar43,0xc9);
  fVar1 = auVar39._0_4_;
  auVar180._0_4_ = auVar46._0_4_ * fVar1;
  fVar100 = auVar39._4_4_;
  auVar180._4_4_ = auVar46._4_4_ * fVar100;
  fVar190 = auVar39._8_4_;
  auVar180._8_4_ = auVar46._8_4_ * fVar190;
  fVar201 = auVar39._12_4_;
  auVar180._12_4_ = auVar46._12_4_ * fVar201;
  auVar46 = vfmsub231ps_fma(auVar180,auVar38,auVar43);
  auVar43 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar181._0_4_ = auVar46._0_4_ * fVar1;
  auVar181._4_4_ = auVar46._4_4_ * fVar100;
  auVar181._8_4_ = auVar46._8_4_ * fVar190;
  auVar181._12_4_ = auVar46._12_4_ * fVar201;
  auVar38 = vfmsub231ps_fma(auVar181,auVar38,auVar51);
  auVar51 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vdpps_avx(auVar5,auVar5,0x7f);
  fVar203 = auVar38._0_4_;
  auVar182._4_12_ = ZEXT812(0) << 0x20;
  auVar182._0_4_ = fVar203;
  auVar46 = vrsqrt14ss_avx512f(auVar49,auVar182);
  auVar40 = vmulss_avx512f(auVar46,ZEXT416(0x3fc00000));
  auVar41 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  fVar107 = auVar46._0_4_;
  fVar108 = auVar40._0_4_ - auVar41._0_4_ * fVar107 * fVar107 * fVar107;
  fVar206 = fVar108 * auVar5._0_4_;
  fVar215 = fVar108 * auVar5._4_4_;
  fVar216 = fVar108 * auVar5._8_4_;
  fVar217 = fVar108 * auVar5._12_4_;
  auVar46 = vdpps_avx(auVar5,auVar47,0x7f);
  auVar132._0_4_ = fVar203 * auVar47._0_4_;
  auVar132._4_4_ = fVar203 * auVar47._4_4_;
  auVar132._8_4_ = fVar203 * auVar47._8_4_;
  auVar132._12_4_ = fVar203 * auVar47._12_4_;
  fVar203 = auVar46._0_4_;
  auVar61._0_4_ = fVar203 * auVar5._0_4_;
  auVar61._4_4_ = fVar203 * auVar5._4_4_;
  auVar61._8_4_ = fVar203 * auVar5._8_4_;
  auVar61._12_4_ = fVar203 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar132,auVar61);
  auVar46 = vrcp14ss_avx512f(auVar49,auVar182);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar46,ZEXT416(0x40000000));
  fVar203 = auVar46._0_4_ * auVar38._0_4_;
  auVar38 = vdpps_avx(auVar43,auVar43,0x7f);
  fVar107 = auVar38._0_4_;
  auVar62._4_12_ = ZEXT812(0) << 0x20;
  auVar62._0_4_ = fVar107;
  auVar46 = vrsqrt14ss_avx512f(auVar49,auVar62);
  auVar47 = vmulss_avx512f(auVar46,ZEXT416(0x3fc00000));
  auVar40 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  fVar109 = auVar46._0_4_;
  fVar109 = auVar47._0_4_ - auVar40._0_4_ * fVar109 * fVar109 * fVar109;
  fVar189 = fVar109 * auVar43._0_4_;
  fVar200 = fVar109 * auVar43._4_4_;
  fVar202 = fVar109 * auVar43._8_4_;
  fVar204 = fVar109 * auVar43._12_4_;
  auVar46 = vdpps_avx(auVar43,auVar51,0x7f);
  auVar60._0_4_ = fVar107 * auVar51._0_4_;
  auVar60._4_4_ = fVar107 * auVar51._4_4_;
  auVar60._8_4_ = fVar107 * auVar51._8_4_;
  auVar60._12_4_ = fVar107 * auVar51._12_4_;
  fVar107 = auVar46._0_4_;
  auVar41._0_4_ = fVar107 * auVar43._0_4_;
  auVar41._4_4_ = fVar107 * auVar43._4_4_;
  auVar41._8_4_ = fVar107 * auVar43._8_4_;
  auVar41._12_4_ = fVar107 * auVar43._12_4_;
  auVar47 = vsubps_avx(auVar60,auVar41);
  auVar46 = vrcp14ss_avx512f(auVar49,auVar62);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar46,ZEXT416(0x40000000));
  fVar107 = auVar46._0_4_ * auVar38._0_4_;
  auVar38 = vshufps_avx(auVar161,auVar161,0xff);
  auVar125._0_4_ = fVar206 * auVar38._0_4_;
  auVar125._4_4_ = fVar215 * auVar38._4_4_;
  auVar125._8_4_ = fVar216 * auVar38._8_4_;
  auVar125._12_4_ = fVar217 * auVar38._12_4_;
  local_540 = vsubps_avx(auVar161,auVar125);
  auVar46 = vshufps_avx(auVar44,auVar44,0xff);
  auVar64._0_4_ = fVar206 * auVar46._0_4_ + auVar38._0_4_ * fVar108 * auVar5._0_4_ * fVar203;
  auVar64._4_4_ = fVar215 * auVar46._4_4_ + auVar38._4_4_ * fVar108 * auVar5._4_4_ * fVar203;
  auVar64._8_4_ = fVar216 * auVar46._8_4_ + auVar38._8_4_ * fVar108 * auVar5._8_4_ * fVar203;
  auVar64._12_4_ = fVar217 * auVar46._12_4_ + auVar38._12_4_ * fVar108 * auVar5._12_4_ * fVar203;
  auVar5 = vsubps_avx(auVar44,auVar64);
  local_550._0_4_ = auVar161._0_4_ + auVar125._0_4_;
  local_550._4_4_ = auVar161._4_4_ + auVar125._4_4_;
  fStack_548 = auVar161._8_4_ + auVar125._8_4_;
  fStack_544 = auVar161._12_4_ + auVar125._12_4_;
  auVar54._0_4_ = fVar118 + auVar64._0_4_;
  auVar54._4_4_ = fVar159 + auVar64._4_4_;
  auVar54._8_4_ = fVar160 + auVar64._8_4_;
  auVar54._12_4_ = fVar205 + auVar64._12_4_;
  auVar38 = vshufps_avx(auVar236,auVar236,0xff);
  auVar133._0_4_ = fVar189 * auVar38._0_4_;
  auVar133._4_4_ = fVar200 * auVar38._4_4_;
  auVar133._8_4_ = fVar202 * auVar38._8_4_;
  auVar133._12_4_ = fVar204 * auVar38._12_4_;
  local_560 = vsubps_avx(auVar236,auVar133);
  auVar46 = vshufps_avx(auVar39,auVar39,0xff);
  auVar42._0_4_ = fVar189 * auVar46._0_4_ + auVar38._0_4_ * fVar109 * auVar47._0_4_ * fVar107;
  auVar42._4_4_ = fVar200 * auVar46._4_4_ + auVar38._4_4_ * fVar109 * auVar47._4_4_ * fVar107;
  auVar42._8_4_ = fVar202 * auVar46._8_4_ + auVar38._8_4_ * fVar109 * auVar47._8_4_ * fVar107;
  auVar42._12_4_ = fVar204 * auVar46._12_4_ + auVar38._12_4_ * fVar109 * auVar47._12_4_ * fVar107;
  auVar38 = vsubps_avx(auVar39,auVar42);
  _local_570 = vaddps_avx512vl(auVar236,auVar133);
  auVar44._0_4_ = fVar1 + auVar42._0_4_;
  auVar44._4_4_ = fVar100 + auVar42._4_4_;
  auVar44._8_4_ = fVar190 + auVar42._8_4_;
  auVar44._12_4_ = fVar201 + auVar42._12_4_;
  auVar46 = vmulps_avx512vl(auVar5,auVar55);
  local_580 = vaddps_avx512vl(local_540,auVar46);
  auVar38 = vmulps_avx512vl(auVar38,auVar55);
  local_590 = vsubps_avx512vl(local_560,auVar38);
  auVar38 = vmulps_avx512vl(auVar54,auVar55);
  _local_5a0 = vaddps_avx512vl(_local_550,auVar38);
  auVar38 = vmulps_avx512vl(auVar44,auVar55);
  _local_5b0 = vsubps_avx512vl(_local_570,auVar38);
  local_4c0 = vsubps_avx(local_540,auVar48);
  uVar101 = local_4c0._0_4_;
  auVar49._4_4_ = uVar101;
  auVar49._0_4_ = uVar101;
  auVar49._8_4_ = uVar101;
  auVar49._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar46 = vshufps_avx(local_4c0,local_4c0,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar1 = pre->ray_space[k].vz.field_0.m128[0];
  fVar100 = pre->ray_space[k].vz.field_0.m128[1];
  fVar190 = pre->ray_space[k].vz.field_0.m128[2];
  fVar201 = pre->ray_space[k].vz.field_0.m128[3];
  auVar45._0_4_ = fVar1 * auVar46._0_4_;
  auVar45._4_4_ = fVar100 * auVar46._4_4_;
  auVar45._8_4_ = fVar190 * auVar46._8_4_;
  auVar45._12_4_ = fVar201 * auVar46._12_4_;
  auVar38 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar4,auVar38);
  auVar51 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar49);
  local_4d0 = vsubps_avx512vl(local_580,auVar48);
  uVar101 = local_4d0._0_4_;
  auVar55._4_4_ = uVar101;
  auVar55._0_4_ = uVar101;
  auVar55._8_4_ = uVar101;
  auVar55._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar46 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar50._0_4_ = fVar1 * auVar46._0_4_;
  auVar50._4_4_ = fVar100 * auVar46._4_4_;
  auVar50._8_4_ = fVar190 * auVar46._8_4_;
  auVar50._12_4_ = fVar201 * auVar46._12_4_;
  auVar38 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar4,auVar38);
  auVar236 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar55);
  local_4e0 = vsubps_avx512vl(local_590,auVar48);
  uVar101 = local_4e0._0_4_;
  auVar58._4_4_ = uVar101;
  auVar58._0_4_ = uVar101;
  auVar58._8_4_ = uVar101;
  auVar58._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar46 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar162._0_4_ = auVar46._0_4_ * fVar1;
  auVar162._4_4_ = auVar46._4_4_ * fVar100;
  auVar162._8_4_ = auVar46._8_4_ * fVar190;
  auVar162._12_4_ = auVar46._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar4,auVar38);
  auVar39 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar58);
  local_4f0 = vsubps_avx(local_560,auVar48);
  uVar101 = local_4f0._0_4_;
  auVar56._4_4_ = uVar101;
  auVar56._0_4_ = uVar101;
  auVar56._8_4_ = uVar101;
  auVar56._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar46 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar169._0_4_ = auVar46._0_4_ * fVar1;
  auVar169._4_4_ = auVar46._4_4_ * fVar100;
  auVar169._8_4_ = auVar46._8_4_ * fVar190;
  auVar169._12_4_ = auVar46._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar4,auVar38);
  auVar40 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar56);
  local_500 = vsubps_avx(_local_550,auVar48);
  uVar101 = local_500._0_4_;
  auVar57._4_4_ = uVar101;
  auVar57._0_4_ = uVar101;
  auVar57._8_4_ = uVar101;
  auVar57._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_500,local_500,0x55);
  auVar46 = vshufps_avx(local_500,local_500,0xaa);
  auVar183._0_4_ = auVar46._0_4_ * fVar1;
  auVar183._4_4_ = auVar46._4_4_ * fVar100;
  auVar183._8_4_ = auVar46._8_4_ * fVar190;
  auVar183._12_4_ = auVar46._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar4,auVar38);
  auVar41 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar57);
  local_510 = vsubps_avx512vl(_local_5a0,auVar48);
  uVar101 = local_510._0_4_;
  auVar63._4_4_ = uVar101;
  auVar63._0_4_ = uVar101;
  auVar63._8_4_ = uVar101;
  auVar63._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_510,local_510,0x55);
  auVar46 = vshufps_avx(local_510,local_510,0xaa);
  auVar191._0_4_ = auVar46._0_4_ * fVar1;
  auVar191._4_4_ = auVar46._4_4_ * fVar100;
  auVar191._8_4_ = auVar46._8_4_ * fVar190;
  auVar191._12_4_ = auVar46._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar4,auVar38);
  auVar42 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar63);
  local_520 = vsubps_avx512vl(_local_5b0,auVar48);
  uVar101 = local_520._0_4_;
  auVar52._4_4_ = uVar101;
  auVar52._0_4_ = uVar101;
  auVar52._8_4_ = uVar101;
  auVar52._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_520,local_520,0x55);
  auVar46 = vshufps_avx(local_520,local_520,0xaa);
  auVar208._0_4_ = auVar46._0_4_ * fVar1;
  auVar208._4_4_ = auVar46._4_4_ * fVar100;
  auVar208._8_4_ = auVar46._8_4_ * fVar190;
  auVar208._12_4_ = auVar46._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar4,auVar38);
  auVar44 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar52);
  local_530 = vsubps_avx512vl(_local_570,auVar48);
  uVar101 = local_530._0_4_;
  auVar53._4_4_ = uVar101;
  auVar53._0_4_ = uVar101;
  auVar53._8_4_ = uVar101;
  auVar53._12_4_ = uVar101;
  auVar38 = vshufps_avx(local_530,local_530,0x55);
  auVar46 = vshufps_avx(local_530,local_530,0xaa);
  auVar134._0_4_ = fVar1 * auVar46._0_4_;
  auVar134._4_4_ = fVar100 * auVar46._4_4_;
  auVar134._8_4_ = fVar190 * auVar46._8_4_;
  auVar134._12_4_ = fVar201 * auVar46._12_4_;
  auVar38 = vfmadd231ps_fma(auVar134,(undefined1  [16])aVar4,auVar38);
  auVar45 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar3,auVar53);
  auVar5 = vmovlhps_avx(auVar51,auVar41);
  auVar47 = vmovlhps_avx(auVar236,auVar42);
  auVar43 = vmovlhps_avx512f(auVar39,auVar44);
  _local_4a0 = vmovlhps_avx512f(auVar40,auVar45);
  auVar46 = vminps_avx(auVar5,auVar47);
  auVar38 = vmaxps_avx(auVar5,auVar47);
  auVar48 = vminps_avx512vl(auVar43,_local_4a0);
  auVar46 = vminps_avx(auVar46,auVar48);
  auVar48 = vmaxps_avx512vl(auVar43,_local_4a0);
  auVar38 = vmaxps_avx(auVar38,auVar48);
  auVar48 = vshufpd_avx(auVar46,auVar46,3);
  auVar46 = vminps_avx(auVar46,auVar48);
  auVar48 = vshufpd_avx(auVar38,auVar38,3);
  auVar38 = vmaxps_avx(auVar38,auVar48);
  auVar46 = vandps_avx512vl(auVar46,auVar232._0_16_);
  auVar38 = vandps_avx512vl(auVar38,auVar232._0_16_);
  auVar38 = vmaxps_avx(auVar46,auVar38);
  auVar46 = vmovshdup_avx(auVar38);
  auVar38 = vmaxss_avx(auVar46,auVar38);
  auVar46 = vmovddup_avx512vl(auVar51);
  auVar48 = vmovddup_avx512vl(auVar236);
  auVar163._0_8_ = auVar39._0_8_;
  auVar163._8_8_ = auVar163._0_8_;
  auVar170._0_8_ = auVar40._0_8_;
  auVar170._8_8_ = auVar170._0_8_;
  local_4b0 = ZEXT416((uint)(auVar38._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_4b0);
  auVar38 = vxorps_avx512vl(local_440._0_16_,auVar233._0_16_);
  local_460 = vbroadcastss_avx512vl(auVar38);
  bVar12 = false;
  uVar28 = 0;
  fVar1 = *(float *)(ray + k * 4 + 0xc0);
  local_470 = vsubps_avx(auVar47,auVar5);
  local_480 = vsubps_avx512vl(auVar43,auVar47);
  local_490 = vsubps_avx512vl(_local_4a0,auVar43);
  local_5c0 = vsubps_avx(_local_550,local_540);
  local_5d0 = vsubps_avx512vl(_local_5a0,local_580);
  local_5e0 = vsubps_avx512vl(_local_5b0,local_590);
  _local_5f0 = vsubps_avx512vl(_local_570,local_560);
  auVar106 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar106);
  auVar38 = ZEXT816(0x3f80000000000000);
  auVar86._32_32_ = auVar106._32_32_;
  auVar40 = auVar38;
LAB_01a35ee6:
  auVar241 = ZEXT3264(local_460);
  auVar239 = ZEXT3264(local_440);
  auVar51 = vshufps_avx(auVar40,auVar40,0x50);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = 0x3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar225._16_4_ = 0x3f800000;
  auVar225._0_16_ = auVar222;
  auVar225._20_4_ = 0x3f800000;
  auVar225._24_4_ = 0x3f800000;
  auVar225._28_4_ = 0x3f800000;
  auVar236 = vsubps_avx(auVar222,auVar51);
  fVar100 = auVar51._0_4_;
  fVar107 = auVar41._0_4_;
  auVar126._0_4_ = fVar107 * fVar100;
  fVar190 = auVar51._4_4_;
  fVar108 = auVar41._4_4_;
  auVar126._4_4_ = fVar108 * fVar190;
  fVar201 = auVar51._8_4_;
  auVar126._8_4_ = fVar107 * fVar201;
  fVar203 = auVar51._12_4_;
  auVar126._12_4_ = fVar108 * fVar203;
  fVar109 = auVar42._0_4_;
  auVar135._0_4_ = fVar109 * fVar100;
  fVar118 = auVar42._4_4_;
  auVar135._4_4_ = fVar118 * fVar190;
  auVar135._8_4_ = fVar109 * fVar201;
  auVar135._12_4_ = fVar118 * fVar203;
  fVar159 = auVar44._0_4_;
  auVar145._0_4_ = fVar159 * fVar100;
  fVar160 = auVar44._4_4_;
  auVar145._4_4_ = fVar160 * fVar190;
  auVar145._8_4_ = fVar159 * fVar201;
  auVar145._12_4_ = fVar160 * fVar203;
  fVar202 = auVar45._0_4_;
  auVar111._0_4_ = fVar202 * fVar100;
  fVar204 = auVar45._4_4_;
  auVar111._4_4_ = fVar204 * fVar190;
  auVar111._8_4_ = fVar202 * fVar201;
  auVar111._12_4_ = fVar204 * fVar203;
  auVar49 = vfmadd231ps_avx512vl(auVar126,auVar236,auVar46);
  auVar50 = vfmadd231ps_avx512vl(auVar135,auVar236,auVar48);
  auVar39 = vfmadd231ps_fma(auVar145,auVar236,auVar163);
  auVar236 = vfmadd231ps_fma(auVar111,auVar170,auVar236);
  auVar51 = vmovshdup_avx(auVar38);
  fVar190 = auVar38._0_4_;
  fVar100 = (auVar51._0_4_ - fVar190) * 0.04761905;
  auVar168._4_4_ = fVar190;
  auVar168._0_4_ = fVar190;
  auVar168._8_4_ = fVar190;
  auVar168._12_4_ = fVar190;
  auVar168._16_4_ = fVar190;
  auVar168._20_4_ = fVar190;
  auVar168._24_4_ = fVar190;
  auVar168._28_4_ = fVar190;
  auVar123._0_8_ = auVar51._0_8_;
  auVar123._8_8_ = auVar123._0_8_;
  auVar123._16_8_ = auVar123._0_8_;
  auVar123._24_8_ = auVar123._0_8_;
  auVar71 = vsubps_avx(auVar123,auVar168);
  uVar101 = auVar49._0_4_;
  auVar124._4_4_ = uVar101;
  auVar124._0_4_ = uVar101;
  auVar124._8_4_ = uVar101;
  auVar124._12_4_ = uVar101;
  auVar124._16_4_ = uVar101;
  auVar124._20_4_ = uVar101;
  auVar124._24_4_ = uVar101;
  auVar124._28_4_ = uVar101;
  auVar186._8_4_ = 1;
  auVar186._0_8_ = 0x100000001;
  auVar186._12_4_ = 1;
  auVar186._16_4_ = 1;
  auVar186._20_4_ = 1;
  auVar186._24_4_ = 1;
  auVar186._28_4_ = 1;
  auVar81 = ZEXT1632(auVar49);
  auVar69 = vpermps_avx2(auVar186,auVar81);
  auVar70 = vbroadcastss_avx512vl(auVar50);
  auVar82 = ZEXT1632(auVar50);
  auVar72 = vpermps_avx512vl(auVar186,auVar82);
  auVar73 = vbroadcastss_avx512vl(auVar39);
  auVar66 = ZEXT1632(auVar39);
  auVar74 = vpermps_avx512vl(auVar186,auVar66);
  auVar75 = vbroadcastss_avx512vl(auVar236);
  auVar78 = ZEXT1632(auVar236);
  auVar76 = vpermps_avx512vl(auVar186,auVar78);
  auVar187._4_4_ = fVar100;
  auVar187._0_4_ = fVar100;
  auVar187._8_4_ = fVar100;
  auVar187._12_4_ = fVar100;
  auVar187._16_4_ = fVar100;
  auVar187._20_4_ = fVar100;
  auVar187._24_4_ = fVar100;
  auVar187._28_4_ = fVar100;
  auVar79 = auVar240._0_32_;
  auVar67 = vpermps_avx512vl(auVar79,auVar81);
  auVar158._8_4_ = 3;
  auVar158._0_8_ = 0x300000003;
  auVar158._12_4_ = 3;
  auVar158._16_4_ = 3;
  auVar158._20_4_ = 3;
  auVar158._24_4_ = 3;
  auVar158._28_4_ = 3;
  auVar68 = vpermps_avx512vl(auVar158,auVar81);
  auVar77 = vpermps_avx512vl(auVar79,auVar82);
  auVar81 = vpermps_avx2(auVar158,auVar82);
  auVar65 = vpermps_avx512vl(auVar79,auVar66);
  auVar82 = vpermps_avx2(auVar158,auVar66);
  auVar66 = vpermps_avx512vl(auVar79,auVar78);
  auVar78 = vpermps_avx512vl(auVar158,auVar78);
  auVar51 = vfmadd132ps_fma(auVar71,auVar168,_DAT_01f7b040);
  auVar71 = vsubps_avx(auVar225,ZEXT1632(auVar51));
  auVar79 = vmulps_avx512vl(auVar70,ZEXT1632(auVar51));
  auVar83 = ZEXT1632(auVar51);
  auVar80 = vmulps_avx512vl(auVar72,auVar83);
  auVar236 = vfmadd231ps_fma(auVar79,auVar71,auVar124);
  auVar39 = vfmadd231ps_fma(auVar80,auVar71,auVar69);
  auVar79 = vmulps_avx512vl(auVar73,auVar83);
  auVar80 = vmulps_avx512vl(auVar74,auVar83);
  auVar70 = vfmadd231ps_avx512vl(auVar79,auVar71,auVar70);
  auVar72 = vfmadd231ps_avx512vl(auVar80,auVar71,auVar72);
  auVar79 = vmulps_avx512vl(auVar75,auVar83);
  auVar80 = ZEXT1632(auVar51);
  auVar76 = vmulps_avx512vl(auVar76,auVar80);
  auVar73 = vfmadd231ps_avx512vl(auVar79,auVar71,auVar73);
  auVar74 = vfmadd231ps_avx512vl(auVar76,auVar71,auVar74);
  fVar201 = auVar51._0_4_;
  fVar203 = auVar51._4_4_;
  auVar19._4_4_ = fVar203 * auVar70._4_4_;
  auVar19._0_4_ = fVar201 * auVar70._0_4_;
  fVar205 = auVar51._8_4_;
  auVar19._8_4_ = fVar205 * auVar70._8_4_;
  fVar189 = auVar51._12_4_;
  auVar19._12_4_ = fVar189 * auVar70._12_4_;
  auVar19._16_4_ = auVar70._16_4_ * 0.0;
  auVar19._20_4_ = auVar70._20_4_ * 0.0;
  auVar19._24_4_ = auVar70._24_4_ * 0.0;
  auVar19._28_4_ = fVar190;
  auVar20._4_4_ = fVar203 * auVar72._4_4_;
  auVar20._0_4_ = fVar201 * auVar72._0_4_;
  auVar20._8_4_ = fVar205 * auVar72._8_4_;
  auVar20._12_4_ = fVar189 * auVar72._12_4_;
  auVar20._16_4_ = auVar72._16_4_ * 0.0;
  auVar20._20_4_ = auVar72._20_4_ * 0.0;
  auVar20._24_4_ = auVar72._24_4_ * 0.0;
  auVar20._28_4_ = auVar69._28_4_;
  auVar236 = vfmadd231ps_fma(auVar19,auVar71,ZEXT1632(auVar236));
  auVar39 = vfmadd231ps_fma(auVar20,auVar71,ZEXT1632(auVar39));
  auVar116._0_4_ = fVar201 * auVar73._0_4_;
  auVar116._4_4_ = fVar203 * auVar73._4_4_;
  auVar116._8_4_ = fVar205 * auVar73._8_4_;
  auVar116._12_4_ = fVar189 * auVar73._12_4_;
  auVar116._16_4_ = auVar73._16_4_ * 0.0;
  auVar116._20_4_ = auVar73._20_4_ * 0.0;
  auVar116._24_4_ = auVar73._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar21._4_4_ = fVar203 * auVar74._4_4_;
  auVar21._0_4_ = fVar201 * auVar74._0_4_;
  auVar21._8_4_ = fVar205 * auVar74._8_4_;
  auVar21._12_4_ = fVar189 * auVar74._12_4_;
  auVar21._16_4_ = auVar74._16_4_ * 0.0;
  auVar21._20_4_ = auVar74._20_4_ * 0.0;
  auVar21._24_4_ = auVar74._24_4_ * 0.0;
  auVar21._28_4_ = auVar73._28_4_;
  auVar49 = vfmadd231ps_fma(auVar116,auVar71,auVar70);
  auVar50 = vfmadd231ps_fma(auVar21,auVar71,auVar72);
  auVar22._28_4_ = auVar72._28_4_;
  auVar22._0_28_ =
       ZEXT1628(CONCAT412(fVar189 * auVar50._12_4_,
                          CONCAT48(fVar205 * auVar50._8_4_,
                                   CONCAT44(fVar203 * auVar50._4_4_,fVar201 * auVar50._0_4_))));
  auVar60 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar189 * auVar49._12_4_,
                                               CONCAT48(fVar205 * auVar49._8_4_,
                                                        CONCAT44(fVar203 * auVar49._4_4_,
                                                                 fVar201 * auVar49._0_4_)))),auVar71
                            ,ZEXT1632(auVar236));
  auVar64 = vfmadd231ps_fma(auVar22,auVar71,ZEXT1632(auVar39));
  auVar69 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar236));
  auVar70 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar39));
  auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar69 = vmulps_avx512vl(auVar69,auVar72);
  auVar70 = vmulps_avx512vl(auVar70,auVar72);
  auVar179._0_4_ = fVar100 * auVar69._0_4_;
  auVar179._4_4_ = fVar100 * auVar69._4_4_;
  auVar179._8_4_ = fVar100 * auVar69._8_4_;
  auVar179._12_4_ = fVar100 * auVar69._12_4_;
  auVar179._16_4_ = fVar100 * auVar69._16_4_;
  auVar179._20_4_ = fVar100 * auVar69._20_4_;
  auVar179._24_4_ = fVar100 * auVar69._24_4_;
  auVar179._28_4_ = 0;
  auVar69 = vmulps_avx512vl(auVar187,auVar70);
  auVar39 = vxorps_avx512vl(auVar75._0_16_,auVar75._0_16_);
  auVar70 = vpermt2ps_avx512vl(ZEXT1632(auVar60),_DAT_01fb9fc0,ZEXT1632(auVar39));
  auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_01fb9fc0,ZEXT1632(auVar39));
  auVar117._0_4_ = auVar179._0_4_ + auVar60._0_4_;
  auVar117._4_4_ = auVar179._4_4_ + auVar60._4_4_;
  auVar117._8_4_ = auVar179._8_4_ + auVar60._8_4_;
  auVar117._12_4_ = auVar179._12_4_ + auVar60._12_4_;
  auVar117._16_4_ = auVar179._16_4_ + 0.0;
  auVar117._20_4_ = auVar179._20_4_ + 0.0;
  auVar117._24_4_ = auVar179._24_4_ + 0.0;
  auVar117._28_4_ = 0;
  auVar83 = ZEXT1632(auVar39);
  auVar74 = vpermt2ps_avx512vl(auVar179,_DAT_01fb9fc0,auVar83);
  auVar75 = vaddps_avx512vl(ZEXT1632(auVar64),auVar69);
  auVar76 = vpermt2ps_avx512vl(auVar69,_DAT_01fb9fc0,auVar83);
  auVar69 = vsubps_avx(auVar70,auVar74);
  auVar74 = vsubps_avx512vl(auVar73,auVar76);
  auVar76 = vmulps_avx512vl(auVar77,auVar80);
  auVar79 = vmulps_avx512vl(auVar81,auVar80);
  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar71,auVar67);
  auVar67 = vfmadd231ps_avx512vl(auVar79,auVar71,auVar68);
  auVar68 = vmulps_avx512vl(auVar65,auVar80);
  auVar79 = vmulps_avx512vl(auVar82,auVar80);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar71,auVar77);
  auVar81 = vfmadd231ps_avx512vl(auVar79,auVar71,auVar81);
  auVar77 = vmulps_avx512vl(auVar66,auVar80);
  auVar66 = vmulps_avx512vl(auVar78,auVar80);
  auVar236 = vfmadd231ps_fma(auVar77,auVar71,auVar65);
  auVar77 = vfmadd231ps_avx512vl(auVar66,auVar71,auVar82);
  auVar65 = vmulps_avx512vl(auVar80,auVar68);
  auVar78 = ZEXT1632(auVar51);
  auVar66 = vmulps_avx512vl(auVar78,auVar81);
  auVar76 = vfmadd231ps_avx512vl(auVar65,auVar71,auVar76);
  auVar67 = vfmadd231ps_avx512vl(auVar66,auVar71,auVar67);
  auVar77 = vmulps_avx512vl(auVar78,auVar77);
  auVar68 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar189 * auVar236._12_4_,
                                          CONCAT48(fVar205 * auVar236._8_4_,
                                                   CONCAT44(fVar203 * auVar236._4_4_,
                                                            fVar201 * auVar236._0_4_)))),auVar71,
                       auVar68);
  auVar81 = vfmadd231ps_avx512vl(auVar77,auVar71,auVar81);
  auVar23._4_4_ = fVar203 * auVar68._4_4_;
  auVar23._0_4_ = fVar201 * auVar68._0_4_;
  auVar23._8_4_ = fVar205 * auVar68._8_4_;
  auVar23._12_4_ = fVar189 * auVar68._12_4_;
  auVar23._16_4_ = auVar68._16_4_ * 0.0;
  auVar23._20_4_ = auVar68._20_4_ * 0.0;
  auVar23._24_4_ = auVar68._24_4_ * 0.0;
  auVar23._28_4_ = auVar82._28_4_;
  auVar82 = vmulps_avx512vl(auVar78,auVar81);
  auVar77 = vfmadd231ps_avx512vl(auVar23,auVar71,auVar76);
  auVar82 = vfmadd231ps_avx512vl(auVar82,auVar67,auVar71);
  auVar71 = vsubps_avx512vl(auVar68,auVar76);
  auVar81 = vsubps_avx512vl(auVar81,auVar67);
  auVar71 = vmulps_avx512vl(auVar71,auVar72);
  auVar81 = vmulps_avx512vl(auVar81,auVar72);
  fVar190 = fVar100 * auVar71._0_4_;
  fVar201 = fVar100 * auVar71._4_4_;
  auVar24._4_4_ = fVar201;
  auVar24._0_4_ = fVar190;
  fVar203 = fVar100 * auVar71._8_4_;
  auVar24._8_4_ = fVar203;
  fVar205 = fVar100 * auVar71._12_4_;
  auVar24._12_4_ = fVar205;
  fVar189 = fVar100 * auVar71._16_4_;
  auVar24._16_4_ = fVar189;
  fVar200 = fVar100 * auVar71._20_4_;
  auVar24._20_4_ = fVar200;
  fVar100 = fVar100 * auVar71._24_4_;
  auVar24._24_4_ = fVar100;
  auVar24._28_4_ = auVar71._28_4_;
  auVar81 = vmulps_avx512vl(auVar187,auVar81);
  auVar72 = vpermt2ps_avx512vl(auVar77,_DAT_01fb9fc0,auVar83);
  auVar76 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,auVar83);
  auVar188._0_4_ = auVar77._0_4_ + fVar190;
  auVar188._4_4_ = auVar77._4_4_ + fVar201;
  auVar188._8_4_ = auVar77._8_4_ + fVar203;
  auVar188._12_4_ = auVar77._12_4_ + fVar205;
  auVar188._16_4_ = auVar77._16_4_ + fVar189;
  auVar188._20_4_ = auVar77._20_4_ + fVar200;
  auVar188._24_4_ = auVar77._24_4_ + fVar100;
  auVar188._28_4_ = auVar77._28_4_ + auVar71._28_4_;
  auVar71 = vpermt2ps_avx512vl(auVar24,_DAT_01fb9fc0,ZEXT1632(auVar39));
  auVar67 = vaddps_avx512vl(auVar82,auVar81);
  auVar81 = vpermt2ps_avx512vl(auVar81,_DAT_01fb9fc0,ZEXT1632(auVar39));
  auVar71 = vsubps_avx(auVar72,auVar71);
  auVar81 = vsubps_avx512vl(auVar76,auVar81);
  auVar129 = ZEXT1632(auVar60);
  auVar68 = vsubps_avx512vl(auVar77,auVar129);
  auVar142 = ZEXT1632(auVar64);
  auVar65 = vsubps_avx512vl(auVar82,auVar142);
  auVar66 = vsubps_avx512vl(auVar72,auVar70);
  auVar68 = vaddps_avx512vl(auVar68,auVar66);
  auVar66 = vsubps_avx512vl(auVar76,auVar73);
  auVar65 = vaddps_avx512vl(auVar65,auVar66);
  auVar66 = vmulps_avx512vl(auVar142,auVar68);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar129,auVar65);
  auVar78 = vmulps_avx512vl(auVar75,auVar68);
  auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar117,auVar65);
  auVar79 = vmulps_avx512vl(auVar74,auVar68);
  auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar69,auVar65);
  auVar80 = vmulps_avx512vl(auVar73,auVar68);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar70,auVar65);
  auVar83 = vmulps_avx512vl(auVar82,auVar68);
  auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar77,auVar65);
  auVar84 = vmulps_avx512vl(auVar67,auVar68);
  auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar188,auVar65);
  auVar85 = vmulps_avx512vl(auVar81,auVar68);
  auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar71,auVar65);
  auVar68 = vmulps_avx512vl(auVar76,auVar68);
  auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar72,auVar65);
  auVar65 = vminps_avx512vl(auVar66,auVar78);
  auVar66 = vmaxps_avx512vl(auVar66,auVar78);
  auVar78 = vminps_avx512vl(auVar79,auVar80);
  auVar65 = vminps_avx512vl(auVar65,auVar78);
  auVar78 = vmaxps_avx512vl(auVar79,auVar80);
  auVar66 = vmaxps_avx512vl(auVar66,auVar78);
  auVar78 = vminps_avx512vl(auVar83,auVar84);
  auVar79 = vmaxps_avx512vl(auVar83,auVar84);
  auVar80 = vminps_avx512vl(auVar85,auVar68);
  auVar78 = vminps_avx512vl(auVar78,auVar80);
  auVar65 = vminps_avx512vl(auVar65,auVar78);
  auVar68 = vmaxps_avx512vl(auVar85,auVar68);
  auVar68 = vmaxps_avx512vl(auVar79,auVar68);
  auVar68 = vmaxps_avx512vl(auVar66,auVar68);
  uVar13 = vcmpps_avx512vl(auVar65,local_440,2);
  uVar14 = vcmpps_avx512vl(auVar68,local_460,5);
  bVar26 = (byte)uVar13 & (byte)uVar14 & 0x7f;
  if (bVar26 != 0) {
    auVar68 = vsubps_avx512vl(auVar70,auVar129);
    auVar65 = vsubps_avx512vl(auVar73,auVar142);
    auVar66 = vsubps_avx512vl(auVar72,auVar77);
    auVar68 = vaddps_avx512vl(auVar68,auVar66);
    auVar66 = vsubps_avx512vl(auVar76,auVar82);
    auVar65 = vaddps_avx512vl(auVar65,auVar66);
    auVar66 = vmulps_avx512vl(auVar142,auVar68);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar65,auVar129);
    auVar75 = vmulps_avx512vl(auVar75,auVar68);
    auVar75 = vfnmadd213ps_avx512vl(auVar117,auVar65,auVar75);
    auVar74 = vmulps_avx512vl(auVar74,auVar68);
    auVar74 = vfnmadd213ps_avx512vl(auVar69,auVar65,auVar74);
    auVar69 = vmulps_avx512vl(auVar73,auVar68);
    auVar73 = vfnmadd231ps_avx512vl(auVar69,auVar65,auVar70);
    auVar69 = vmulps_avx512vl(auVar82,auVar68);
    auVar82 = vfnmadd231ps_avx512vl(auVar69,auVar65,auVar77);
    auVar69 = vmulps_avx512vl(auVar67,auVar68);
    auVar67 = vfnmadd213ps_avx512vl(auVar188,auVar65,auVar69);
    auVar69 = vmulps_avx512vl(auVar81,auVar68);
    auVar77 = vfnmadd213ps_avx512vl(auVar71,auVar65,auVar69);
    auVar71 = vmulps_avx512vl(auVar76,auVar68);
    auVar72 = vfnmadd231ps_avx512vl(auVar71,auVar72,auVar65);
    auVar69 = vminps_avx(auVar66,auVar75);
    auVar71 = vmaxps_avx(auVar66,auVar75);
    auVar70 = vminps_avx(auVar74,auVar73);
    auVar70 = vminps_avx(auVar69,auVar70);
    auVar69 = vmaxps_avx(auVar74,auVar73);
    auVar71 = vmaxps_avx(auVar71,auVar69);
    auVar81 = vminps_avx(auVar82,auVar67);
    auVar69 = vmaxps_avx(auVar82,auVar67);
    auVar82 = vminps_avx(auVar77,auVar72);
    auVar81 = vminps_avx(auVar81,auVar82);
    auVar81 = vminps_avx(auVar70,auVar81);
    auVar70 = vmaxps_avx(auVar77,auVar72);
    auVar69 = vmaxps_avx(auVar69,auVar70);
    auVar71 = vmaxps_avx(auVar71,auVar69);
    uVar13 = vcmpps_avx512vl(auVar71,local_460,5);
    uVar14 = vcmpps_avx512vl(auVar81,local_440,2);
    bVar26 = bVar26 & (byte)uVar13 & (byte)uVar14;
    if (bVar26 != 0) {
      auStack_630[uVar28] = (uint)bVar26;
      uVar13 = vmovlps_avx(auVar38);
      (&uStack_420)[uVar28] = uVar13;
      uVar2 = vmovlps_avx(auVar40);
      auStack_3a0[uVar28] = uVar2;
      uVar28 = (ulong)((int)uVar28 + 1);
    }
  }
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar106 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar232 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar233 = ZEXT1664(auVar38);
  auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar234 = ZEXT3264(auVar71);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar235 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar237 = ZEXT1664(auVar38);
  auVar99._32_32_ = auVar86._32_32_;
  auVar99._0_32_ = _DAT_01fb9fe0;
  auVar238 = ZEXT3264(_DAT_01fb9fe0);
LAB_01a363d1:
  do {
    do {
      do {
        if ((int)uVar28 == 0) {
          if (bVar12) goto LAB_01a37309;
          uVar101 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar18._4_4_ = uVar101;
          auVar18._0_4_ = uVar101;
          auVar18._8_4_ = uVar101;
          auVar18._12_4_ = uVar101;
          auVar18._16_4_ = uVar101;
          auVar18._20_4_ = uVar101;
          auVar18._24_4_ = uVar101;
          auVar18._28_4_ = uVar101;
          uVar13 = vcmpps_avx512vl(local_3c0,auVar18,2);
          uVar33 = (ulong)((uint)uVar33 & (uint)uVar33 + 0xff & (uint)uVar13);
          goto LAB_01a357e3;
        }
        uVar27 = (int)uVar28 - 1;
        uVar29 = (ulong)uVar27;
        uVar7 = auStack_630[uVar29];
        auVar40._8_8_ = 0;
        auVar40._0_8_ = auStack_3a0[uVar29];
        uVar2 = 0;
        for (uVar32 = (ulong)uVar7; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
          uVar2 = uVar2 + 1;
        }
        uVar31 = uVar7 - 1 & uVar7;
        bVar36 = uVar31 == 0;
        auStack_630[uVar29] = uVar31;
        if (bVar36) {
          uVar28 = (ulong)uVar27;
        }
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar2;
        auVar38 = vpunpcklqdq_avx(auVar102,ZEXT416((int)uVar2 + 1));
        auVar86._32_32_ = auVar99._32_32_;
        auVar38 = vcvtqq2ps_avx512vl(auVar38);
        auVar38 = vmulps_avx512vl(auVar38,auVar235._0_16_);
        uVar101 = *(undefined4 *)((long)&uStack_420 + uVar29 * 8 + 4);
        auVar15._4_4_ = uVar101;
        auVar15._0_4_ = uVar101;
        auVar15._8_4_ = uVar101;
        auVar15._12_4_ = uVar101;
        auVar51 = vmulps_avx512vl(auVar38,auVar15);
        auVar236 = auVar237._0_16_;
        auVar38 = vsubps_avx512vl(auVar236,auVar38);
        uVar101 = *(undefined4 *)(&uStack_420 + uVar29);
        auVar16._4_4_ = uVar101;
        auVar16._0_4_ = uVar101;
        auVar16._8_4_ = uVar101;
        auVar16._12_4_ = uVar101;
        auVar38 = vfmadd231ps_avx512vl(auVar51,auVar38,auVar16);
        auVar51 = vmovshdup_avx(auVar38);
        fVar100 = auVar51._0_4_ - auVar38._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar100));
        if (uVar7 == 0 || bVar36) goto LAB_01a35ee6;
        auVar51 = vshufps_avx(auVar40,auVar40,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar100));
        auVar50 = vsubps_avx512vl(auVar236,auVar51);
        fVar190 = auVar51._0_4_;
        auVar136._0_4_ = fVar190 * fVar107;
        fVar201 = auVar51._4_4_;
        auVar136._4_4_ = fVar201 * fVar108;
        fVar203 = auVar51._8_4_;
        auVar136._8_4_ = fVar203 * fVar107;
        fVar205 = auVar51._12_4_;
        auVar136._12_4_ = fVar205 * fVar108;
        auVar146._0_4_ = fVar190 * fVar109;
        auVar146._4_4_ = fVar201 * fVar118;
        auVar146._8_4_ = fVar203 * fVar109;
        auVar146._12_4_ = fVar205 * fVar118;
        auVar152._0_4_ = fVar190 * fVar159;
        auVar152._4_4_ = fVar201 * fVar160;
        auVar152._8_4_ = fVar203 * fVar159;
        auVar152._12_4_ = fVar205 * fVar160;
        auVar119._0_4_ = fVar190 * fVar202;
        auVar119._4_4_ = fVar201 * fVar204;
        auVar119._8_4_ = fVar203 * fVar202;
        auVar119._12_4_ = fVar205 * fVar204;
        auVar51 = vfmadd231ps_fma(auVar136,auVar50,auVar46);
        auVar39 = vfmadd231ps_fma(auVar146,auVar50,auVar48);
        auVar49 = vfmadd231ps_fma(auVar152,auVar50,auVar163);
        auVar50 = vfmadd231ps_fma(auVar119,auVar50,auVar170);
        auVar130._16_16_ = auVar51;
        auVar130._0_16_ = auVar51;
        auVar143._16_16_ = auVar39;
        auVar143._0_16_ = auVar39;
        auVar150._16_16_ = auVar49;
        auVar150._0_16_ = auVar49;
        auVar69 = vpermps_avx512vl(auVar238._0_32_,ZEXT1632(auVar38));
        auVar71 = vsubps_avx(auVar143,auVar130);
        auVar39 = vfmadd213ps_fma(auVar71,auVar69,auVar130);
        auVar71 = vsubps_avx(auVar150,auVar143);
        auVar60 = vfmadd213ps_fma(auVar71,auVar69,auVar143);
        auVar51 = vsubps_avx(auVar50,auVar49);
        auVar144._16_16_ = auVar51;
        auVar144._0_16_ = auVar51;
        auVar51 = vfmadd213ps_fma(auVar144,auVar69,auVar150);
        auVar71 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar39));
        auVar39 = vfmadd213ps_fma(auVar71,auVar69,ZEXT1632(auVar39));
        auVar71 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar60));
        auVar51 = vfmadd213ps_fma(auVar71,auVar69,ZEXT1632(auVar60));
        auVar71 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar39));
        auVar63 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar71,auVar69);
        auVar86._0_32_ = vmulps_avx512vl(auVar71,auVar234._0_32_);
        fVar190 = fVar100 * 0.33333334;
        auVar153._0_8_ =
             CONCAT44(auVar63._4_4_ + fVar190 * auVar86._4_4_,
                      auVar63._0_4_ + fVar190 * auVar86._0_4_);
        auVar153._8_4_ = auVar63._8_4_ + fVar190 * auVar86._8_4_;
        auVar153._12_4_ = auVar63._12_4_ + fVar190 * auVar86._12_4_;
        auVar137._0_4_ = fVar190 * auVar86._16_4_;
        auVar137._4_4_ = fVar190 * auVar86._20_4_;
        auVar137._8_4_ = fVar190 * auVar86._24_4_;
        auVar137._12_4_ = fVar190 * auVar86._28_4_;
        auVar58 = vsubps_avx((undefined1  [16])0x0,auVar137);
        auVar60 = vshufpd_avx(auVar63,auVar63,3);
        auVar64 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar51 = vsubps_avx(auVar60,auVar63);
        auVar39 = vsubps_avx(auVar64,(undefined1  [16])0x0);
        auVar171._0_4_ = auVar51._0_4_ + auVar39._0_4_;
        auVar171._4_4_ = auVar51._4_4_ + auVar39._4_4_;
        auVar171._8_4_ = auVar51._8_4_ + auVar39._8_4_;
        auVar171._12_4_ = auVar51._12_4_ + auVar39._12_4_;
        auVar51 = vshufps_avx(auVar63,auVar63,0xb1);
        auVar39 = vshufps_avx(auVar153,auVar153,0xb1);
        auVar49 = vshufps_avx(auVar58,auVar58,0xb1);
        auVar50 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar223._4_4_ = auVar171._0_4_;
        auVar223._0_4_ = auVar171._0_4_;
        auVar223._8_4_ = auVar171._0_4_;
        auVar223._12_4_ = auVar171._0_4_;
        auVar54 = vshufps_avx(auVar171,auVar171,0x55);
        fVar190 = auVar54._0_4_;
        auVar184._0_4_ = auVar51._0_4_ * fVar190;
        fVar201 = auVar54._4_4_;
        auVar184._4_4_ = auVar51._4_4_ * fVar201;
        fVar203 = auVar54._8_4_;
        auVar184._8_4_ = auVar51._8_4_ * fVar203;
        fVar205 = auVar54._12_4_;
        auVar184._12_4_ = auVar51._12_4_ * fVar205;
        auVar192._0_4_ = auVar39._0_4_ * fVar190;
        auVar192._4_4_ = auVar39._4_4_ * fVar201;
        auVar192._8_4_ = auVar39._8_4_ * fVar203;
        auVar192._12_4_ = auVar39._12_4_ * fVar205;
        auVar209._0_4_ = auVar49._0_4_ * fVar190;
        auVar209._4_4_ = auVar49._4_4_ * fVar201;
        auVar209._8_4_ = auVar49._8_4_ * fVar203;
        auVar209._12_4_ = auVar49._12_4_ * fVar205;
        auVar172._0_4_ = auVar50._0_4_ * fVar190;
        auVar172._4_4_ = auVar50._4_4_ * fVar201;
        auVar172._8_4_ = auVar50._8_4_ * fVar203;
        auVar172._12_4_ = auVar50._12_4_ * fVar205;
        auVar51 = vfmadd231ps_fma(auVar184,auVar223,auVar63);
        auVar39 = vfmadd231ps_fma(auVar192,auVar223,auVar153);
        auVar56 = vfmadd231ps_fma(auVar209,auVar223,auVar58);
        auVar57 = vfmadd231ps_fma(auVar172,(undefined1  [16])0x0,auVar223);
        auVar54 = vshufpd_avx(auVar51,auVar51,1);
        auVar55 = vshufpd_avx(auVar39,auVar39,1);
        auVar99._16_48_ = auVar86._16_48_;
        auVar52 = vshufpd_avx512vl(auVar56,auVar56,1);
        auVar53 = vshufpd_avx512vl(auVar57,auVar57,1);
        auVar49 = vminss_avx(auVar51,auVar39);
        auVar51 = vmaxss_avx(auVar39,auVar51);
        auVar50 = vminss_avx(auVar56,auVar57);
        auVar39 = vmaxss_avx(auVar57,auVar56);
        auVar49 = vminss_avx(auVar49,auVar50);
        auVar51 = vmaxss_avx(auVar39,auVar51);
        auVar50 = vminss_avx(auVar54,auVar55);
        auVar39 = vmaxss_avx(auVar55,auVar54);
        auVar54 = vminss_avx512f(auVar52,auVar53);
        auVar55 = vmaxss_avx512f(auVar53,auVar52);
        auVar39 = vmaxss_avx(auVar55,auVar39);
        auVar99._0_16_ = vminss_avx512f(auVar50,auVar54);
        fVar201 = auVar39._0_4_;
        fVar190 = auVar51._0_4_;
        if (auVar49._0_4_ < 0.0001) {
          bVar37 = fVar201 == -0.0001;
          bVar34 = NAN(fVar201);
          if (fVar201 <= -0.0001) goto LAB_01a365fe;
          break;
        }
LAB_01a365fe:
        vucomiss_avx512f(auVar99._0_16_);
        bVar37 = fVar201 <= -0.0001;
        bVar35 = -0.0001 < fVar190;
        bVar34 = bVar37;
        if (!bVar37) break;
        uVar13 = vcmpps_avx512vl(auVar49,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar14 = vcmpps_avx512vl(auVar99._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar26 = (byte)uVar13 & (byte)uVar14;
        bVar25 = (bVar26 & 1) == 0;
        bVar37 = bVar35 && bVar25;
        bVar34 = bVar35 && (bVar26 & 1) == 0;
      } while (!bVar35 || !bVar25);
      auVar55 = vxorps_avx512vl(auVar241._0_16_,auVar241._0_16_);
      auVar241 = ZEXT1664(auVar55);
      vcmpss_avx512f(auVar49,auVar55,1);
      uVar13 = vcmpss_avx512f(auVar51,auVar55,1);
      bVar35 = (bool)((byte)uVar13 & 1);
      auVar88._16_48_ = auVar99._16_48_;
      auVar88._0_16_ = auVar242._0_16_;
      auVar87._4_60_ = auVar88._4_60_;
      auVar87._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar242._0_4_);
      vucomiss_avx512f(auVar87._0_16_);
      bVar34 = (bool)(!bVar37 | bVar34);
      bVar35 = bVar34 == false;
      auVar90._16_48_ = auVar99._16_48_;
      auVar90._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar89._4_60_ = auVar90._4_60_;
      auVar89._0_4_ = (uint)bVar34 * auVar55._0_4_ + (uint)!bVar34 * 0x7f800000;
      auVar54 = auVar89._0_16_;
      auVar92._16_48_ = auVar99._16_48_;
      auVar92._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar91._4_60_ = auVar92._4_60_;
      auVar91._0_4_ = (uint)bVar34 * auVar55._0_4_ + (uint)!bVar34 * -0x800000;
      auVar50 = auVar91._0_16_;
      auVar56 = vxorps_avx512vl(auVar239._0_16_,auVar239._0_16_);
      auVar239 = ZEXT1664(auVar56);
      uVar13 = vcmpss_avx512f(auVar99._0_16_,auVar55,1);
      bVar37 = (bool)((byte)uVar13 & 1);
      auVar94._16_48_ = auVar99._16_48_;
      auVar94._0_16_ = auVar242._0_16_;
      auVar93._4_60_ = auVar94._4_60_;
      auVar93._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * auVar242._0_4_);
      vucomiss_avx512f(auVar93._0_16_);
      if ((bVar34) || (bVar35)) {
        auVar55 = vucomiss_avx512f(auVar49);
        if ((bVar34) || (bVar35)) {
          auVar57 = vxorps_avx512vl(auVar49,auVar233._0_16_);
          auVar49 = vsubss_avx512f(auVar55,auVar49);
          auVar49 = vdivss_avx512f(auVar57,auVar49);
          auVar55 = vsubss_avx512f(ZEXT416(0x3f800000),auVar49);
          auVar55 = vfmadd213ss_avx512f(auVar55,auVar56,auVar49);
          auVar49 = auVar55;
        }
        else {
          auVar49 = vxorps_avx512vl(auVar55,auVar55);
          vucomiss_avx512f(auVar49);
          auVar55 = ZEXT416(0x3f800000);
          if ((bVar34) || (bVar35)) {
            auVar55 = SUB6416(ZEXT464(0xff800000),0);
            auVar49 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar54 = vminss_avx512f(auVar54,auVar49);
        auVar50 = vmaxss_avx(auVar55,auVar50);
      }
      auVar242 = ZEXT464(0x3f800000);
      uVar13 = vcmpss_avx512f(auVar39,auVar56,1);
      bVar37 = (bool)((byte)uVar13 & 1);
      auVar39 = auVar242._0_16_;
      fVar203 = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * 0x3f800000);
      if ((auVar87._0_4_ != fVar203) || (NAN(auVar87._0_4_) || NAN(fVar203))) {
        if ((fVar201 != fVar190) || (NAN(fVar201) || NAN(fVar190))) {
          auVar51 = vxorps_avx512vl(auVar51,auVar233._0_16_);
          auVar173._0_4_ = auVar51._0_4_ / (fVar201 - fVar190);
          auVar173._4_12_ = auVar51._4_12_;
          auVar51 = vsubss_avx512f(auVar39,auVar173);
          auVar51 = vfmadd213ss_avx512f(auVar51,auVar56,auVar173);
          auVar49 = auVar51;
        }
        else if ((fVar190 != 0.0) ||
                (auVar51 = auVar39, auVar49 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar190))) {
          auVar51 = SUB6416(ZEXT464(0xff800000),0);
          auVar49 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar54 = vminss_avx(auVar54,auVar49);
        auVar50 = vmaxss_avx(auVar51,auVar50);
      }
      bVar37 = auVar93._0_4_ != fVar203;
      auVar51 = vminss_avx512f(auVar54,auVar39);
      auVar96._16_48_ = auVar99._16_48_;
      auVar96._0_16_ = auVar54;
      auVar95._4_60_ = auVar96._4_60_;
      auVar95._0_4_ = (uint)bVar37 * auVar51._0_4_ + (uint)!bVar37 * auVar54._0_4_;
      auVar51 = vmaxss_avx512f(auVar39,auVar50);
      auVar98._16_48_ = auVar99._16_48_;
      auVar98._0_16_ = auVar50;
      auVar97._4_60_ = auVar98._4_60_;
      auVar97._0_4_ = (uint)bVar37 * auVar51._0_4_ + (uint)!bVar37 * auVar50._0_4_;
      auVar51 = vmaxss_avx512f(auVar56,auVar95._0_16_);
      auVar99._0_16_ = vminss_avx512f(auVar97._0_16_,auVar39);
    } while (auVar99._0_4_ < auVar51._0_4_);
    auVar57 = vmaxss_avx512f(auVar56,ZEXT416((uint)(auVar51._0_4_ + -0.1)));
    auVar53 = vminss_avx512f(ZEXT416((uint)(auVar99._0_4_ + 0.1)),auVar39);
    auVar120._0_8_ = auVar63._0_8_;
    auVar120._8_8_ = auVar120._0_8_;
    auVar193._8_8_ = auVar153._0_8_;
    auVar193._0_8_ = auVar153._0_8_;
    auVar210._8_8_ = auVar58._0_8_;
    auVar210._0_8_ = auVar58._0_8_;
    auVar51 = vshufpd_avx(auVar153,auVar153,3);
    auVar49 = vshufpd_avx(auVar58,auVar58,3);
    auVar50 = vshufps_avx(auVar57,auVar53,0);
    auVar55 = vsubps_avx512vl(auVar236,auVar50);
    fVar190 = auVar50._0_4_;
    auVar147._0_4_ = fVar190 * auVar60._0_4_;
    fVar201 = auVar50._4_4_;
    auVar147._4_4_ = fVar201 * auVar60._4_4_;
    fVar203 = auVar50._8_4_;
    auVar147._8_4_ = fVar203 * auVar60._8_4_;
    fVar205 = auVar50._12_4_;
    auVar147._12_4_ = fVar205 * auVar60._12_4_;
    auVar154._0_4_ = fVar190 * auVar51._0_4_;
    auVar154._4_4_ = fVar201 * auVar51._4_4_;
    auVar154._8_4_ = fVar203 * auVar51._8_4_;
    auVar154._12_4_ = fVar205 * auVar51._12_4_;
    auVar226._0_4_ = auVar49._0_4_ * fVar190;
    auVar226._4_4_ = auVar49._4_4_ * fVar201;
    auVar226._8_4_ = auVar49._8_4_ * fVar203;
    auVar226._12_4_ = auVar49._12_4_ * fVar205;
    auVar138._0_4_ = fVar190 * auVar64._0_4_;
    auVar138._4_4_ = fVar201 * auVar64._4_4_;
    auVar138._8_4_ = fVar203 * auVar64._8_4_;
    auVar138._12_4_ = fVar205 * auVar64._12_4_;
    auVar60 = vfmadd231ps_fma(auVar147,auVar55,auVar120);
    auVar64 = vfmadd231ps_fma(auVar154,auVar55,auVar193);
    auVar54 = vfmadd231ps_fma(auVar226,auVar55,auVar210);
    auVar55 = vfmadd231ps_fma(auVar138,auVar55,ZEXT816(0));
    auVar49 = vsubss_avx512f(auVar39,auVar57);
    auVar51 = vmovshdup_avx(auVar40);
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar57._0_4_)),auVar40,auVar49);
    auVar49 = vsubss_avx512f(auVar39,auVar53);
    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar53._0_4_)),auVar40,auVar49);
    auVar58 = vdivss_avx512f(auVar39,ZEXT416((uint)fVar100));
    auVar51 = vsubps_avx(auVar64,auVar60);
    auVar125 = auVar106._0_16_;
    auVar49 = vmulps_avx512vl(auVar51,auVar125);
    auVar51 = vsubps_avx(auVar54,auVar64);
    auVar50 = vmulps_avx512vl(auVar51,auVar125);
    auVar51 = vsubps_avx(auVar55,auVar54);
    auVar51 = vmulps_avx512vl(auVar51,auVar125);
    auVar40 = vminps_avx(auVar50,auVar51);
    auVar51 = vmaxps_avx(auVar50,auVar51);
    auVar40 = vminps_avx(auVar49,auVar40);
    auVar51 = vmaxps_avx(auVar49,auVar51);
    auVar49 = vshufpd_avx(auVar40,auVar40,3);
    auVar50 = vshufpd_avx(auVar51,auVar51,3);
    auVar40 = vminps_avx(auVar40,auVar49);
    auVar51 = vmaxps_avx(auVar51,auVar50);
    fVar100 = auVar58._0_4_;
    auVar174._0_4_ = auVar40._0_4_ * fVar100;
    auVar174._4_4_ = auVar40._4_4_ * fVar100;
    auVar174._8_4_ = auVar40._8_4_ * fVar100;
    auVar174._12_4_ = auVar40._12_4_ * fVar100;
    auVar164._0_4_ = fVar100 * auVar51._0_4_;
    auVar164._4_4_ = fVar100 * auVar51._4_4_;
    auVar164._8_4_ = fVar100 * auVar51._8_4_;
    auVar164._12_4_ = fVar100 * auVar51._12_4_;
    auVar58 = vdivss_avx512f(auVar39,ZEXT416((uint)(auVar53._0_4_ - auVar52._0_4_)));
    auVar51 = vshufpd_avx(auVar60,auVar60,3);
    auVar40 = vshufpd_avx(auVar64,auVar64,3);
    auVar49 = vshufpd_avx(auVar54,auVar54,3);
    auVar50 = vshufpd_avx(auVar55,auVar55,3);
    auVar51 = vsubps_avx(auVar51,auVar60);
    auVar60 = vsubps_avx(auVar40,auVar64);
    auVar64 = vsubps_avx(auVar49,auVar54);
    auVar50 = vsubps_avx(auVar50,auVar55);
    auVar40 = vminps_avx(auVar51,auVar60);
    auVar51 = vmaxps_avx(auVar51,auVar60);
    auVar49 = vminps_avx(auVar64,auVar50);
    auVar49 = vminps_avx(auVar40,auVar49);
    auVar40 = vmaxps_avx(auVar64,auVar50);
    auVar51 = vmaxps_avx(auVar51,auVar40);
    fVar100 = auVar58._0_4_;
    auVar211._0_4_ = fVar100 * auVar49._0_4_;
    auVar211._4_4_ = fVar100 * auVar49._4_4_;
    auVar211._8_4_ = fVar100 * auVar49._8_4_;
    auVar211._12_4_ = fVar100 * auVar49._12_4_;
    auVar194._0_4_ = fVar100 * auVar51._0_4_;
    auVar194._4_4_ = fVar100 * auVar51._4_4_;
    auVar194._8_4_ = fVar100 * auVar51._8_4_;
    auVar194._12_4_ = fVar100 * auVar51._12_4_;
    auVar50 = vinsertps_avx(auVar38,auVar52,0x10);
    auVar59 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9f90,auVar53);
    auVar110._0_4_ = auVar50._0_4_ + auVar59._0_4_;
    auVar110._4_4_ = auVar50._4_4_ + auVar59._4_4_;
    auVar110._8_4_ = auVar50._8_4_ + auVar59._8_4_;
    auVar110._12_4_ = auVar50._12_4_ + auVar59._12_4_;
    auVar17._8_4_ = 0x3f000000;
    auVar17._0_8_ = 0x3f0000003f000000;
    auVar17._12_4_ = 0x3f000000;
    auVar58 = vmulps_avx512vl(auVar110,auVar17);
    auVar40 = vshufps_avx(auVar58,auVar58,0x54);
    uVar101 = auVar58._0_4_;
    auVar112._4_4_ = uVar101;
    auVar112._0_4_ = uVar101;
    auVar112._8_4_ = uVar101;
    auVar112._12_4_ = uVar101;
    auVar49 = vfmadd213ps_fma(local_470,auVar112,auVar5);
    auVar60 = vfmadd213ps_fma(local_480,auVar112,auVar47);
    auVar64 = vfmadd213ps_fma(local_490,auVar112,auVar43);
    auVar51 = vsubps_avx(auVar60,auVar49);
    auVar49 = vfmadd213ps_fma(auVar51,auVar112,auVar49);
    auVar51 = vsubps_avx(auVar64,auVar60);
    auVar51 = vfmadd213ps_fma(auVar51,auVar112,auVar60);
    auVar51 = vsubps_avx(auVar51,auVar49);
    auVar49 = vfmadd231ps_fma(auVar49,auVar51,auVar112);
    auVar54 = vmulps_avx512vl(auVar51,auVar125);
    auVar219._8_8_ = auVar49._0_8_;
    auVar219._0_8_ = auVar49._0_8_;
    auVar51 = vshufpd_avx(auVar49,auVar49,3);
    auVar49 = vshufps_avx(auVar58,auVar58,0x55);
    auVar60 = vsubps_avx(auVar51,auVar219);
    auVar64 = vfmadd231ps_fma(auVar219,auVar49,auVar60);
    auVar227._8_8_ = auVar54._0_8_;
    auVar227._0_8_ = auVar54._0_8_;
    auVar51 = vshufpd_avx(auVar54,auVar54,3);
    auVar51 = vsubps_avx512vl(auVar51,auVar227);
    auVar51 = vfmadd213ps_avx512vl(auVar51,auVar49,auVar227);
    auVar113._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
    auVar113._8_4_ = auVar60._8_4_ ^ 0x80000000;
    auVar113._12_4_ = auVar60._12_4_ ^ 0x80000000;
    auVar49 = vmovshdup_avx512vl(auVar51);
    auVar228._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
    auVar228._8_4_ = auVar49._8_4_ ^ 0x80000000;
    auVar228._12_4_ = auVar49._12_4_ ^ 0x80000000;
    auVar54 = vmovshdup_avx512vl(auVar60);
    auVar55 = vpermt2ps_avx512vl(auVar228,ZEXT416(5),auVar60);
    auVar241 = ZEXT464(0x40400000);
    auVar49 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar49._0_4_ * auVar60._0_4_)),auVar51,auVar54);
    auVar60 = vpermt2ps_avx512vl(auVar51,SUB6416(ZEXT464(4),0),auVar113);
    auVar139._0_4_ = auVar49._0_4_;
    auVar139._4_4_ = auVar139._0_4_;
    auVar139._8_4_ = auVar139._0_4_;
    auVar139._12_4_ = auVar139._0_4_;
    auVar51 = vdivps_avx(auVar55,auVar139);
    auVar61 = vdivps_avx512vl(auVar60,auVar139);
    fVar100 = auVar64._0_4_;
    auVar49 = vshufps_avx(auVar64,auVar64,0x55);
    auVar220._0_4_ = fVar100 * auVar51._0_4_ + auVar49._0_4_ * auVar61._0_4_;
    auVar220._4_4_ = fVar100 * auVar51._4_4_ + auVar49._4_4_ * auVar61._4_4_;
    auVar220._8_4_ = fVar100 * auVar51._8_4_ + auVar49._8_4_ * auVar61._8_4_;
    auVar220._12_4_ = fVar100 * auVar51._12_4_ + auVar49._12_4_ * auVar61._12_4_;
    auVar57 = vsubps_avx(auVar40,auVar220);
    auVar49 = vmovshdup_avx(auVar51);
    auVar40 = vinsertps_avx(auVar174,auVar211,0x1c);
    auVar229._0_4_ = auVar49._0_4_ * auVar40._0_4_;
    auVar229._4_4_ = auVar49._4_4_ * auVar40._4_4_;
    auVar229._8_4_ = auVar49._8_4_ * auVar40._8_4_;
    auVar229._12_4_ = auVar49._12_4_ * auVar40._12_4_;
    auVar63 = vinsertps_avx512f(auVar164,auVar194,0x1c);
    auVar49 = vmulps_avx512vl(auVar49,auVar63);
    auVar55 = vminps_avx512vl(auVar229,auVar49);
    auVar64 = vmaxps_avx(auVar49,auVar229);
    auVar54 = vmovshdup_avx(auVar61);
    auVar49 = vinsertps_avx(auVar211,auVar174,0x4c);
    auVar212._0_4_ = auVar54._0_4_ * auVar49._0_4_;
    auVar212._4_4_ = auVar54._4_4_ * auVar49._4_4_;
    auVar212._8_4_ = auVar54._8_4_ * auVar49._8_4_;
    auVar212._12_4_ = auVar54._12_4_ * auVar49._12_4_;
    auVar60 = vinsertps_avx(auVar194,auVar164,0x4c);
    auVar195._0_4_ = auVar54._0_4_ * auVar60._0_4_;
    auVar195._4_4_ = auVar54._4_4_ * auVar60._4_4_;
    auVar195._8_4_ = auVar54._8_4_ * auVar60._8_4_;
    auVar195._12_4_ = auVar54._12_4_ * auVar60._12_4_;
    auVar54 = vminps_avx(auVar212,auVar195);
    auVar55 = vaddps_avx512vl(auVar55,auVar54);
    auVar54 = vmaxps_avx(auVar195,auVar212);
    auVar196._0_4_ = auVar64._0_4_ + auVar54._0_4_;
    auVar196._4_4_ = auVar64._4_4_ + auVar54._4_4_;
    auVar196._8_4_ = auVar64._8_4_ + auVar54._8_4_;
    auVar196._12_4_ = auVar64._12_4_ + auVar54._12_4_;
    auVar213._8_8_ = 0x3f80000000000000;
    auVar213._0_8_ = 0x3f80000000000000;
    auVar64 = vsubps_avx(auVar213,auVar196);
    auVar54 = vsubps_avx(auVar213,auVar55);
    auVar55 = vsubps_avx(auVar50,auVar58);
    auVar58 = vsubps_avx(auVar59,auVar58);
    fVar205 = auVar55._0_4_;
    auVar230._0_4_ = fVar205 * auVar64._0_4_;
    fVar189 = auVar55._4_4_;
    auVar230._4_4_ = fVar189 * auVar64._4_4_;
    fVar200 = auVar55._8_4_;
    auVar230._8_4_ = fVar200 * auVar64._8_4_;
    fVar206 = auVar55._12_4_;
    auVar230._12_4_ = fVar206 * auVar64._12_4_;
    auVar62 = vbroadcastss_avx512vl(auVar51);
    auVar40 = vmulps_avx512vl(auVar62,auVar40);
    auVar63 = vmulps_avx512vl(auVar62,auVar63);
    auVar62 = vminps_avx512vl(auVar40,auVar63);
    auVar63 = vmaxps_avx512vl(auVar63,auVar40);
    auVar40 = vbroadcastss_avx512vl(auVar61);
    auVar49 = vmulps_avx512vl(auVar40,auVar49);
    auVar40 = vmulps_avx512vl(auVar40,auVar60);
    auVar60 = vminps_avx512vl(auVar49,auVar40);
    auVar60 = vaddps_avx512vl(auVar62,auVar60);
    auVar55 = vmulps_avx512vl(auVar55,auVar54);
    fVar100 = auVar58._0_4_;
    auVar197._0_4_ = fVar100 * auVar64._0_4_;
    fVar190 = auVar58._4_4_;
    auVar197._4_4_ = fVar190 * auVar64._4_4_;
    fVar201 = auVar58._8_4_;
    auVar197._8_4_ = fVar201 * auVar64._8_4_;
    fVar203 = auVar58._12_4_;
    auVar197._12_4_ = fVar203 * auVar64._12_4_;
    auVar214._0_4_ = fVar100 * auVar54._0_4_;
    auVar214._4_4_ = fVar190 * auVar54._4_4_;
    auVar214._8_4_ = fVar201 * auVar54._8_4_;
    auVar214._12_4_ = fVar203 * auVar54._12_4_;
    auVar40 = vmaxps_avx(auVar40,auVar49);
    auVar165._0_4_ = auVar63._0_4_ + auVar40._0_4_;
    auVar165._4_4_ = auVar63._4_4_ + auVar40._4_4_;
    auVar165._8_4_ = auVar63._8_4_ + auVar40._8_4_;
    auVar165._12_4_ = auVar63._12_4_ + auVar40._12_4_;
    auVar175._8_8_ = 0x3f800000;
    auVar175._0_8_ = 0x3f800000;
    auVar40 = vsubps_avx(auVar175,auVar165);
    auVar49 = vsubps_avx512vl(auVar175,auVar60);
    auVar224._0_4_ = fVar205 * auVar40._0_4_;
    auVar224._4_4_ = fVar189 * auVar40._4_4_;
    auVar224._8_4_ = fVar200 * auVar40._8_4_;
    auVar224._12_4_ = fVar206 * auVar40._12_4_;
    auVar221._0_4_ = fVar205 * auVar49._0_4_;
    auVar221._4_4_ = fVar189 * auVar49._4_4_;
    auVar221._8_4_ = fVar200 * auVar49._8_4_;
    auVar221._12_4_ = fVar206 * auVar49._12_4_;
    auVar166._0_4_ = fVar100 * auVar40._0_4_;
    auVar166._4_4_ = fVar190 * auVar40._4_4_;
    auVar166._8_4_ = fVar201 * auVar40._8_4_;
    auVar166._12_4_ = fVar203 * auVar40._12_4_;
    auVar176._0_4_ = fVar100 * auVar49._0_4_;
    auVar176._4_4_ = fVar190 * auVar49._4_4_;
    auVar176._8_4_ = fVar201 * auVar49._8_4_;
    auVar176._12_4_ = fVar203 * auVar49._12_4_;
    auVar40 = vminps_avx(auVar224,auVar221);
    auVar49 = vminps_avx512vl(auVar166,auVar176);
    auVar60 = vminps_avx512vl(auVar40,auVar49);
    auVar40 = vmaxps_avx(auVar221,auVar224);
    auVar49 = vmaxps_avx(auVar176,auVar166);
    auVar49 = vmaxps_avx(auVar49,auVar40);
    auVar64 = vminps_avx512vl(auVar230,auVar55);
    auVar40 = vminps_avx(auVar197,auVar214);
    auVar40 = vminps_avx(auVar64,auVar40);
    auVar40 = vhaddps_avx(auVar60,auVar40);
    auVar99._0_16_ = vmaxps_avx512vl(auVar55,auVar230);
    auVar60 = vmaxps_avx(auVar214,auVar197);
    auVar60 = vmaxps_avx(auVar60,auVar99._0_16_);
    auVar49 = vhaddps_avx(auVar49,auVar60);
    auVar40 = vshufps_avx(auVar40,auVar40,0xe8);
    auVar49 = vshufps_avx(auVar49,auVar49,0xe8);
    auVar167._0_4_ = auVar40._0_4_ + auVar57._0_4_;
    auVar167._4_4_ = auVar40._4_4_ + auVar57._4_4_;
    auVar167._8_4_ = auVar40._8_4_ + auVar57._8_4_;
    auVar167._12_4_ = auVar40._12_4_ + auVar57._12_4_;
    auVar177._0_4_ = auVar49._0_4_ + auVar57._0_4_;
    auVar177._4_4_ = auVar49._4_4_ + auVar57._4_4_;
    auVar177._8_4_ = auVar49._8_4_ + auVar57._8_4_;
    auVar177._12_4_ = auVar49._12_4_ + auVar57._12_4_;
    auVar40 = vmaxps_avx(auVar50,auVar167);
    auVar49 = vminps_avx(auVar177,auVar59);
    uVar2 = vcmpps_avx512vl(auVar49,auVar40,1);
  } while ((uVar2 & 3) != 0);
  uVar2 = vcmpps_avx512vl(auVar177,auVar59,1);
  uVar13 = vcmpps_avx512vl(auVar38,auVar167,1);
  if (((ushort)uVar13 & (ushort)uVar2 & 1) == 0) {
    bVar26 = 0;
  }
  else {
    auVar40 = vmovshdup_avx(auVar167);
    bVar26 = auVar52._0_4_ < auVar40._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar28 || uVar7 != 0 && !bVar36) | bVar26) != 1) goto LAB_01a37286;
  lVar30 = 0xc9;
  do {
    lVar30 = lVar30 + -1;
    if (lVar30 == 0) goto LAB_01a363d1;
    auVar38 = vsubss_avx512f(auVar39,auVar57);
    fVar201 = auVar38._0_4_;
    fVar100 = fVar201 * fVar201 * fVar201;
    auVar38 = vmulss_avx512f(auVar57,ZEXT416(0x40400000));
    fVar190 = auVar38._0_4_ * fVar201 * fVar201;
    fVar203 = auVar57._0_4_;
    auVar38 = vmulss_avx512f(ZEXT416((uint)(fVar203 * fVar203)),ZEXT416(0x40400000));
    fVar201 = fVar201 * auVar38._0_4_;
    auVar127._4_4_ = fVar100;
    auVar127._0_4_ = fVar100;
    auVar127._8_4_ = fVar100;
    auVar127._12_4_ = fVar100;
    auVar121._4_4_ = fVar190;
    auVar121._0_4_ = fVar190;
    auVar121._8_4_ = fVar190;
    auVar121._12_4_ = fVar190;
    auVar103._4_4_ = fVar201;
    auVar103._0_4_ = fVar201;
    auVar103._8_4_ = fVar201;
    auVar103._12_4_ = fVar201;
    fVar203 = fVar203 * fVar203 * fVar203;
    auVar148._0_4_ = (float)local_4a0._0_4_ * fVar203;
    auVar148._4_4_ = (float)local_4a0._4_4_ * fVar203;
    auVar148._8_4_ = fStack_498 * fVar203;
    auVar148._12_4_ = fStack_494 * fVar203;
    auVar38 = vfmadd231ps_fma(auVar148,auVar43,auVar103);
    auVar38 = vfmadd231ps_fma(auVar38,auVar47,auVar121);
    auVar38 = vfmadd231ps_fma(auVar38,auVar5,auVar127);
    auVar104._8_8_ = auVar38._0_8_;
    auVar104._0_8_ = auVar38._0_8_;
    auVar38 = vshufpd_avx(auVar38,auVar38,3);
    auVar40 = vshufps_avx(auVar57,auVar57,0x55);
    auVar38 = vsubps_avx(auVar38,auVar104);
    auVar40 = vfmadd213ps_fma(auVar38,auVar40,auVar104);
    fVar100 = auVar40._0_4_;
    auVar38 = vshufps_avx(auVar40,auVar40,0x55);
    auVar105._0_4_ = auVar51._0_4_ * fVar100 + auVar61._0_4_ * auVar38._0_4_;
    auVar105._4_4_ = auVar51._4_4_ * fVar100 + auVar61._4_4_ * auVar38._4_4_;
    auVar105._8_4_ = auVar51._8_4_ * fVar100 + auVar61._8_4_ * auVar38._8_4_;
    auVar105._12_4_ = auVar51._12_4_ * fVar100 + auVar61._12_4_ * auVar38._12_4_;
    auVar57 = vsubps_avx(auVar57,auVar105);
    auVar38 = vandps_avx512vl(auVar40,auVar232._0_16_);
    auVar99._0_16_ = vprolq_avx512vl(auVar38,0x20);
    auVar38 = vmaxss_avx(auVar99._0_16_,auVar38);
    bVar36 = (float)local_4b0._0_4_ < auVar38._0_4_;
  } while ((float)local_4b0._0_4_ <= auVar38._0_4_);
  auVar38 = vucomiss_avx512f(auVar56);
  if (bVar36) goto LAB_01a363d1;
  auVar51 = vucomiss_avx512f(auVar38);
  auVar242 = ZEXT1664(auVar51);
  if (bVar36) goto LAB_01a363d1;
  vmovshdup_avx(auVar38);
  auVar51 = vucomiss_avx512f(auVar56);
  if (bVar36) goto LAB_01a363d1;
  auVar39 = vucomiss_avx512f(auVar51);
  auVar242 = ZEXT1664(auVar39);
  if (bVar36) goto LAB_01a363d1;
  auVar40 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar58 = vinsertps_avx(auVar40,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar40 = vdpps_avx(auVar58,local_4c0,0x7f);
  auVar49 = vdpps_avx(auVar58,local_4d0,0x7f);
  auVar50 = vdpps_avx(auVar58,local_4e0,0x7f);
  auVar60 = vdpps_avx(auVar58,local_4f0,0x7f);
  auVar64 = vdpps_avx(auVar58,local_500,0x7f);
  auVar54 = vdpps_avx(auVar58,local_510,0x7f);
  auVar55 = vdpps_avx(auVar58,local_520,0x7f);
  auVar58 = vdpps_avx(auVar58,local_530,0x7f);
  auVar56 = vsubss_avx512f(auVar39,auVar51);
  fVar100 = auVar51._0_4_;
  auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar100 * auVar64._0_4_)),auVar56,auVar40);
  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar100)),auVar56,auVar49);
  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar100)),auVar56,auVar50);
  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar100 * auVar58._0_4_)),auVar56,auVar60);
  auVar39 = vsubss_avx512f(auVar39,auVar38);
  auVar149._0_4_ = auVar39._0_4_;
  fVar190 = auVar149._0_4_ * auVar149._0_4_ * auVar149._0_4_;
  auVar39 = vmulss_avx512f(auVar38,ZEXT416(0x40400000));
  fVar201 = auVar39._0_4_ * auVar149._0_4_ * auVar149._0_4_;
  fVar100 = auVar38._0_4_;
  auVar140._0_4_ = fVar100 * fVar100;
  auVar140._4_4_ = auVar38._4_4_ * auVar38._4_4_;
  auVar140._8_4_ = auVar38._8_4_ * auVar38._8_4_;
  auVar140._12_4_ = auVar38._12_4_ * auVar38._12_4_;
  auVar99._0_16_ = vmulss_avx512f(auVar140,ZEXT416(0x40400000));
  fVar203 = auVar149._0_4_ * auVar99._0_4_;
  fVar189 = fVar100 * auVar140._0_4_;
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar189 * auVar50._0_4_)),ZEXT416((uint)fVar203),auVar49)
  ;
  auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar201),auVar40);
  auVar51 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar190),auVar51);
  fVar205 = auVar51._0_4_;
  if ((fVar205 < fVar1) || (fVar200 = *(float *)(ray + k * 4 + 0x200), fVar200 < fVar205))
  goto LAB_01a363d1;
  auVar51 = vshufps_avx(auVar38,auVar38,0x55);
  auVar40 = vsubps_avx512vl(auVar236,auVar51);
  fVar206 = auVar51._0_4_;
  auVar178._0_4_ = fVar206 * (float)local_550._0_4_;
  fVar215 = auVar51._4_4_;
  auVar178._4_4_ = fVar215 * (float)local_550._4_4_;
  fVar216 = auVar51._8_4_;
  auVar178._8_4_ = fVar216 * fStack_548;
  fVar217 = auVar51._12_4_;
  auVar178._12_4_ = fVar217 * fStack_544;
  auVar185._0_4_ = fVar206 * (float)local_5a0._0_4_;
  auVar185._4_4_ = fVar215 * (float)local_5a0._4_4_;
  auVar185._8_4_ = fVar216 * fStack_598;
  auVar185._12_4_ = fVar217 * fStack_594;
  auVar198._0_4_ = fVar206 * (float)local_5b0._0_4_;
  auVar198._4_4_ = fVar215 * (float)local_5b0._4_4_;
  auVar198._8_4_ = fVar216 * fStack_5a8;
  auVar198._12_4_ = fVar217 * fStack_5a4;
  auVar155._0_4_ = fVar206 * (float)local_570._0_4_;
  auVar155._4_4_ = fVar215 * (float)local_570._4_4_;
  auVar155._8_4_ = fVar216 * fStack_568;
  auVar155._12_4_ = fVar217 * fStack_564;
  auVar51 = vfmadd231ps_fma(auVar178,auVar40,local_540);
  auVar236 = vfmadd231ps_fma(auVar185,auVar40,local_580);
  auVar39 = vfmadd231ps_fma(auVar198,auVar40,local_590);
  auVar40 = vfmadd231ps_fma(auVar155,auVar40,local_560);
  auVar51 = vsubps_avx(auVar236,auVar51);
  auVar236 = vsubps_avx(auVar39,auVar236);
  auVar39 = vsubps_avx(auVar40,auVar39);
  auVar199._0_4_ = fVar100 * auVar236._0_4_;
  auVar199._4_4_ = fVar100 * auVar236._4_4_;
  auVar199._8_4_ = fVar100 * auVar236._8_4_;
  auVar199._12_4_ = fVar100 * auVar236._12_4_;
  auVar149._4_4_ = auVar149._0_4_;
  auVar149._8_4_ = auVar149._0_4_;
  auVar149._12_4_ = auVar149._0_4_;
  auVar51 = vfmadd231ps_fma(auVar199,auVar149,auVar51);
  auVar156._0_4_ = fVar100 * auVar39._0_4_;
  auVar156._4_4_ = fVar100 * auVar39._4_4_;
  auVar156._8_4_ = fVar100 * auVar39._8_4_;
  auVar156._12_4_ = fVar100 * auVar39._12_4_;
  auVar236 = vfmadd231ps_fma(auVar156,auVar149,auVar236);
  auVar157._0_4_ = fVar100 * auVar236._0_4_;
  auVar157._4_4_ = fVar100 * auVar236._4_4_;
  auVar157._8_4_ = fVar100 * auVar236._8_4_;
  auVar157._12_4_ = fVar100 * auVar236._12_4_;
  auVar51 = vfmadd231ps_fma(auVar157,auVar149,auVar51);
  auVar99._0_16_ = vmulps_avx512vl(auVar51,auVar125);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar26 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01a37269;
    auVar141._0_4_ = fVar189 * (float)local_5f0._0_4_;
    auVar141._4_4_ = fVar189 * (float)local_5f0._4_4_;
    auVar141._8_4_ = fVar189 * fStack_5e8;
    auVar141._12_4_ = fVar189 * fStack_5e4;
    auVar128._4_4_ = fVar203;
    auVar128._0_4_ = fVar203;
    auVar128._8_4_ = fVar203;
    auVar128._12_4_ = fVar203;
    auVar51 = vfmadd132ps_fma(auVar128,auVar141,local_5e0);
    auVar122._4_4_ = fVar201;
    auVar122._0_4_ = fVar201;
    auVar122._8_4_ = fVar201;
    auVar122._12_4_ = fVar201;
    auVar51 = vfmadd132ps_fma(auVar122,auVar51,local_5d0);
    auVar114._4_4_ = fVar190;
    auVar114._0_4_ = fVar190;
    auVar114._8_4_ = fVar190;
    auVar114._12_4_ = fVar190;
    auVar39 = vfmadd132ps_fma(auVar114,auVar51,local_5c0);
    auVar51 = vshufps_avx(auVar39,auVar39,0xc9);
    auVar236 = vshufps_avx(auVar99._0_16_,auVar99._0_16_,0xc9);
    auVar115._0_4_ = auVar39._0_4_ * auVar236._0_4_;
    auVar115._4_4_ = auVar39._4_4_ * auVar236._4_4_;
    auVar115._8_4_ = auVar39._8_4_ * auVar236._8_4_;
    auVar115._12_4_ = auVar39._12_4_ * auVar236._12_4_;
    auVar51 = vfmsub231ps_fma(auVar115,auVar99._0_16_,auVar51);
    local_200 = vbroadcastss_avx512f(auVar38);
    auVar86 = vbroadcastss_avx512f(ZEXT416(1));
    local_1c0 = vpermps_avx512f(auVar86,ZEXT1664(auVar38));
    auVar86 = vpermps_avx512f(auVar86,ZEXT1664(auVar51));
    auVar99 = vbroadcastss_avx512f(ZEXT416(2));
    local_280 = vpermps_avx512f(auVar99,ZEXT1664(auVar51));
    local_240 = vbroadcastss_avx512f(auVar51);
    local_2c0[0] = (RTCHitN)auVar86[0];
    local_2c0[1] = (RTCHitN)auVar86[1];
    local_2c0[2] = (RTCHitN)auVar86[2];
    local_2c0[3] = (RTCHitN)auVar86[3];
    local_2c0[4] = (RTCHitN)auVar86[4];
    local_2c0[5] = (RTCHitN)auVar86[5];
    local_2c0[6] = (RTCHitN)auVar86[6];
    local_2c0[7] = (RTCHitN)auVar86[7];
    local_2c0[8] = (RTCHitN)auVar86[8];
    local_2c0[9] = (RTCHitN)auVar86[9];
    local_2c0[10] = (RTCHitN)auVar86[10];
    local_2c0[0xb] = (RTCHitN)auVar86[0xb];
    local_2c0[0xc] = (RTCHitN)auVar86[0xc];
    local_2c0[0xd] = (RTCHitN)auVar86[0xd];
    local_2c0[0xe] = (RTCHitN)auVar86[0xe];
    local_2c0[0xf] = (RTCHitN)auVar86[0xf];
    local_2c0[0x10] = (RTCHitN)auVar86[0x10];
    local_2c0[0x11] = (RTCHitN)auVar86[0x11];
    local_2c0[0x12] = (RTCHitN)auVar86[0x12];
    local_2c0[0x13] = (RTCHitN)auVar86[0x13];
    local_2c0[0x14] = (RTCHitN)auVar86[0x14];
    local_2c0[0x15] = (RTCHitN)auVar86[0x15];
    local_2c0[0x16] = (RTCHitN)auVar86[0x16];
    local_2c0[0x17] = (RTCHitN)auVar86[0x17];
    local_2c0[0x18] = (RTCHitN)auVar86[0x18];
    local_2c0[0x19] = (RTCHitN)auVar86[0x19];
    local_2c0[0x1a] = (RTCHitN)auVar86[0x1a];
    local_2c0[0x1b] = (RTCHitN)auVar86[0x1b];
    local_2c0[0x1c] = (RTCHitN)auVar86[0x1c];
    local_2c0[0x1d] = (RTCHitN)auVar86[0x1d];
    local_2c0[0x1e] = (RTCHitN)auVar86[0x1e];
    local_2c0[0x1f] = (RTCHitN)auVar86[0x1f];
    local_2c0[0x20] = (RTCHitN)auVar86[0x20];
    local_2c0[0x21] = (RTCHitN)auVar86[0x21];
    local_2c0[0x22] = (RTCHitN)auVar86[0x22];
    local_2c0[0x23] = (RTCHitN)auVar86[0x23];
    local_2c0[0x24] = (RTCHitN)auVar86[0x24];
    local_2c0[0x25] = (RTCHitN)auVar86[0x25];
    local_2c0[0x26] = (RTCHitN)auVar86[0x26];
    local_2c0[0x27] = (RTCHitN)auVar86[0x27];
    local_2c0[0x28] = (RTCHitN)auVar86[0x28];
    local_2c0[0x29] = (RTCHitN)auVar86[0x29];
    local_2c0[0x2a] = (RTCHitN)auVar86[0x2a];
    local_2c0[0x2b] = (RTCHitN)auVar86[0x2b];
    local_2c0[0x2c] = (RTCHitN)auVar86[0x2c];
    local_2c0[0x2d] = (RTCHitN)auVar86[0x2d];
    local_2c0[0x2e] = (RTCHitN)auVar86[0x2e];
    local_2c0[0x2f] = (RTCHitN)auVar86[0x2f];
    local_2c0[0x30] = (RTCHitN)auVar86[0x30];
    local_2c0[0x31] = (RTCHitN)auVar86[0x31];
    local_2c0[0x32] = (RTCHitN)auVar86[0x32];
    local_2c0[0x33] = (RTCHitN)auVar86[0x33];
    local_2c0[0x34] = (RTCHitN)auVar86[0x34];
    local_2c0[0x35] = (RTCHitN)auVar86[0x35];
    local_2c0[0x36] = (RTCHitN)auVar86[0x36];
    local_2c0[0x37] = (RTCHitN)auVar86[0x37];
    local_2c0[0x38] = (RTCHitN)auVar86[0x38];
    local_2c0[0x39] = (RTCHitN)auVar86[0x39];
    local_2c0[0x3a] = (RTCHitN)auVar86[0x3a];
    local_2c0[0x3b] = (RTCHitN)auVar86[0x3b];
    local_2c0[0x3c] = (RTCHitN)auVar86[0x3c];
    local_2c0[0x3d] = (RTCHitN)auVar86[0x3d];
    local_2c0[0x3e] = (RTCHitN)auVar86[0x3e];
    local_2c0[0x3f] = (RTCHitN)auVar86[0x3f];
    local_180 = local_300._0_8_;
    uStack_178 = local_300._8_8_;
    uStack_170 = local_300._16_8_;
    uStack_168 = local_300._24_8_;
    uStack_160 = local_300._32_8_;
    uStack_158 = local_300._40_8_;
    uStack_150 = local_300._48_8_;
    uStack_148 = local_300._56_8_;
    auVar86 = vmovdqa64_avx512f(local_340);
    local_140 = vmovdqa64_avx512f(auVar86);
    vpcmpeqd_avx2(auVar86._0_32_,auVar86._0_32_);
    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
    *(float *)(ray + k * 4 + 0x200) = fVar205;
    auVar99 = vmovdqa64_avx512f(local_380);
    local_400 = vmovdqa64_avx512f(auVar99);
    local_620.valid = (int *)local_400;
    local_620.geometryUserPtr = pGVar8->userPtr;
    local_620.context = context->user;
    local_620.ray = (RTCRayN *)ray;
    local_620.hit = local_2c0;
    local_620.N = 0x10;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&local_620);
      auVar242 = ZEXT464(0x3f800000);
      auVar238 = ZEXT3264(_DAT_01fb9fe0);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar237 = ZEXT1664(auVar38);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar235 = ZEXT1664(auVar38);
      auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar234 = ZEXT3264(auVar71);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar233 = ZEXT1664(auVar38);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar232 = ZEXT1664(auVar38);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar106 = ZEXT1664(auVar38);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
      auVar243 = ZEXT1664(auVar38);
      auVar71 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar240 = ZEXT3264(auVar71);
      auVar99 = vmovdqa64_avx512f(local_400);
    }
    uVar13 = vptestmd_avx512f(auVar99,auVar99);
    if ((short)uVar13 != 0) {
      p_Var11 = context->args->filter;
      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var11)(&local_620);
        auVar242 = ZEXT464(0x3f800000);
        auVar238 = ZEXT3264(_DAT_01fb9fe0);
        auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar237 = ZEXT1664(auVar38);
        auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar235 = ZEXT1664(auVar38);
        auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar234 = ZEXT3264(auVar71);
        auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar233 = ZEXT1664(auVar38);
        auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar232 = ZEXT1664(auVar38);
        auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar106 = ZEXT1664(auVar38);
        auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
        auVar243 = ZEXT1664(auVar38);
        auVar71 = vbroadcastss_avx512vl(ZEXT416(2));
        auVar240 = ZEXT3264(auVar71);
        auVar99 = vmovdqa64_avx512f(local_400);
      }
      uVar2 = vptestmd_avx512f(auVar99,auVar99);
      auVar86 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar36 = (bool)((byte)uVar2 & 1);
      auVar99._0_4_ = (uint)bVar36 * auVar86._0_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x200)
      ;
      bVar36 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar99._4_4_ = (uint)bVar36 * auVar86._4_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x204)
      ;
      bVar36 = (bool)((byte)(uVar2 >> 2) & 1);
      auVar99._8_4_ = (uint)bVar36 * auVar86._8_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x208)
      ;
      bVar36 = (bool)((byte)(uVar2 >> 3) & 1);
      auVar99._12_4_ =
           (uint)bVar36 * auVar86._12_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x20c);
      bVar36 = (bool)((byte)(uVar2 >> 4) & 1);
      auVar99._16_4_ =
           (uint)bVar36 * auVar86._16_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x210);
      bVar36 = (bool)((byte)(uVar2 >> 5) & 1);
      auVar99._20_4_ =
           (uint)bVar36 * auVar86._20_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x214);
      bVar36 = (bool)((byte)(uVar2 >> 6) & 1);
      auVar99._24_4_ =
           (uint)bVar36 * auVar86._24_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x218);
      bVar36 = (bool)((byte)(uVar2 >> 7) & 1);
      auVar99._28_4_ =
           (uint)bVar36 * auVar86._28_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x21c);
      bVar36 = (bool)((byte)(uVar2 >> 8) & 1);
      auVar99._32_4_ =
           (uint)bVar36 * auVar86._32_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x220);
      bVar36 = (bool)((byte)(uVar2 >> 9) & 1);
      auVar99._36_4_ =
           (uint)bVar36 * auVar86._36_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x224);
      bVar36 = (bool)((byte)(uVar2 >> 10) & 1);
      auVar99._40_4_ =
           (uint)bVar36 * auVar86._40_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x228);
      bVar36 = (bool)((byte)(uVar2 >> 0xb) & 1);
      auVar99._44_4_ =
           (uint)bVar36 * auVar86._44_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x22c);
      bVar36 = (bool)((byte)(uVar2 >> 0xc) & 1);
      auVar99._48_4_ =
           (uint)bVar36 * auVar86._48_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x230);
      bVar36 = (bool)((byte)(uVar2 >> 0xd) & 1);
      auVar99._52_4_ =
           (uint)bVar36 * auVar86._52_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x234);
      bVar36 = (bool)((byte)(uVar2 >> 0xe) & 1);
      auVar99._56_4_ =
           (uint)bVar36 * auVar86._56_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x238);
      bVar36 = SUB81(uVar2 >> 0xf,0);
      auVar99._60_4_ =
           (uint)bVar36 * auVar86._60_4_ | (uint)!bVar36 * *(int *)(local_620.ray + 0x23c);
      *(undefined1 (*) [64])(local_620.ray + 0x200) = auVar99;
      bVar26 = 1;
      if ((short)uVar2 != 0) goto LAB_01a37269;
    }
    *(float *)(ray + k * 4 + 0x200) = fVar200;
  }
  bVar26 = 0;
LAB_01a37269:
  bVar12 = (bool)(bVar12 | bVar26);
  goto LAB_01a363d1;
LAB_01a37286:
  auVar40 = vinsertps_avx(auVar52,auVar53,0x10);
  goto LAB_01a35ee6;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }